

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O0

void rgb32_yuv420_sseu(uint32_t width,uint32_t height,uint8_t *RGBA,uint32_t RGBA_stride,uint8_t *Y,
                      uint8_t *U,uint8_t *V,uint32_t Y_stride,uint32_t UV_stride,YCbCrType yuv_type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  RGB2YUVParam *pRVar27;
  ulong uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  undefined1 auVar65 [16];
  __m128i rgb8;
  __m128i rgb7;
  __m128i rgb6;
  __m128i rgb5;
  __m128i rgb4;
  __m128i rgb3;
  __m128i rgb2;
  __m128i rgb1;
  __m128i tmp8;
  __m128i tmp7;
  __m128i tmp6;
  __m128i tmp5;
  __m128i tmp4;
  __m128i tmp3;
  __m128i tmp2;
  __m128i tmp1;
  __m128i cr;
  __m128i cb;
  __m128i Y_1;
  __m128i cr2_16;
  __m128i cr1_16;
  __m128i cb2_16;
  __m128i cb1_16;
  __m128i y2_16;
  __m128i y1_16;
  __m128i b_16;
  __m128i g_16;
  __m128i r_16;
  uint8_t *local_2450;
  uint8_t *v_ptr;
  uint8_t *u_ptr;
  uint8_t *y_ptr2;
  uint8_t *y_ptr1;
  uint8_t *rgb_ptr2;
  uint8_t *rgb_ptr1;
  uint32_t y;
  uint32_t x;
  RGB2YUVParam *param;
  uint8_t *U_local;
  uint8_t *Y_local;
  uint32_t RGBA_stride_local;
  uint8_t *RGBA_local;
  uint32_t height_local;
  uint32_t width_local;
  byte local_21a8;
  byte bStack_21a7;
  byte bStack_21a6;
  byte bStack_21a4;
  byte bStack_21a3;
  byte bStack_21a2;
  byte local_2198;
  byte bStack_2197;
  byte bStack_2196;
  byte bStack_2194;
  byte bStack_2193;
  byte bStack_2192;
  byte local_2188;
  byte bStack_2187;
  byte bStack_2186;
  byte bStack_2184;
  byte bStack_2183;
  byte bStack_2182;
  byte local_2178;
  byte bStack_2177;
  byte bStack_2176;
  byte bStack_2174;
  byte bStack_2173;
  byte bStack_2172;
  byte local_2168;
  byte bStack_2167;
  byte bStack_2166;
  byte bStack_2164;
  byte bStack_2163;
  byte bStack_2162;
  byte local_2158;
  byte bStack_2157;
  byte bStack_2156;
  byte bStack_2154;
  byte bStack_2153;
  byte bStack_2152;
  byte local_2148;
  byte bStack_2147;
  byte bStack_2146;
  byte bStack_2144;
  byte bStack_2143;
  byte bStack_2142;
  byte local_2138;
  byte bStack_2137;
  byte bStack_2136;
  byte bStack_2134;
  byte bStack_2133;
  byte bStack_2132;
  byte local_1ee8;
  byte bStack_1ee7;
  byte bStack_1ee6;
  byte bStack_1ee4;
  byte bStack_1ee3;
  byte bStack_1ee2;
  byte local_1ed8;
  byte bStack_1ed7;
  byte bStack_1ed6;
  byte bStack_1ed4;
  byte bStack_1ed3;
  byte bStack_1ed2;
  byte local_1ec8;
  byte bStack_1ec7;
  byte bStack_1ec6;
  byte bStack_1ec4;
  byte bStack_1ec3;
  byte bStack_1ec2;
  byte local_1eb8;
  byte bStack_1eb7;
  byte bStack_1eb6;
  byte bStack_1eb4;
  byte bStack_1eb3;
  byte bStack_1eb2;
  byte local_1ea8;
  byte bStack_1ea7;
  byte bStack_1ea6;
  byte bStack_1ea4;
  byte bStack_1ea3;
  byte bStack_1ea2;
  byte local_1e98;
  byte bStack_1e97;
  byte bStack_1e96;
  byte bStack_1e94;
  byte bStack_1e93;
  byte bStack_1e92;
  byte local_1e88;
  byte bStack_1e87;
  byte bStack_1e86;
  byte bStack_1e84;
  byte bStack_1e83;
  byte bStack_1e82;
  byte local_1e78;
  byte bStack_1e77;
  byte bStack_1e76;
  byte bStack_1e74;
  byte bStack_1e73;
  byte bStack_1e72;
  byte bStack_1be0;
  byte bStack_1bdf;
  byte bStack_1bde;
  byte bStack_1bdc;
  byte bStack_1bdb;
  byte bStack_1bda;
  byte bStack_1bd0;
  byte bStack_1bcf;
  byte bStack_1bce;
  byte bStack_1bcc;
  byte bStack_1bcb;
  byte bStack_1bca;
  byte bStack_1bc0;
  byte bStack_1bbf;
  byte bStack_1bbe;
  byte bStack_1bbc;
  byte bStack_1bbb;
  byte bStack_1bba;
  byte bStack_1bb0;
  byte bStack_1baf;
  byte bStack_1bae;
  byte bStack_1bac;
  byte bStack_1bab;
  byte bStack_1baa;
  byte bStack_1ba0;
  byte bStack_1b9f;
  byte bStack_1b9e;
  byte bStack_1b9c;
  byte bStack_1b9b;
  byte bStack_1b9a;
  byte bStack_1b90;
  byte bStack_1b8f;
  byte bStack_1b8e;
  byte bStack_1b8c;
  byte bStack_1b8b;
  byte bStack_1b8a;
  byte bStack_1b80;
  byte bStack_1b7f;
  byte bStack_1b7e;
  byte bStack_1b7c;
  byte bStack_1b7b;
  byte bStack_1b7a;
  byte bStack_1b70;
  byte bStack_1b6f;
  byte bStack_1b6e;
  byte bStack_1b6c;
  byte bStack_1b6b;
  byte bStack_1b6a;
  byte bStack_18e0;
  byte bStack_18df;
  byte bStack_18de;
  byte bStack_18dc;
  byte bStack_18db;
  byte bStack_18da;
  byte bStack_18d0;
  byte bStack_18cf;
  byte bStack_18ce;
  byte bStack_18cc;
  byte bStack_18cb;
  byte bStack_18ca;
  byte bStack_18c0;
  byte bStack_18bf;
  byte bStack_18be;
  byte bStack_18bc;
  byte bStack_18bb;
  byte bStack_18ba;
  byte bStack_18b0;
  byte bStack_18af;
  byte bStack_18ae;
  byte bStack_18ac;
  byte bStack_18ab;
  byte bStack_18aa;
  byte bStack_18a0;
  byte bStack_189f;
  byte bStack_189e;
  byte bStack_189c;
  byte bStack_189b;
  byte bStack_189a;
  byte bStack_1890;
  byte bStack_188f;
  byte bStack_188e;
  byte bStack_188c;
  byte bStack_188b;
  byte bStack_188a;
  byte bStack_1880;
  byte bStack_187f;
  byte bStack_187e;
  byte bStack_187c;
  byte bStack_187b;
  byte bStack_187a;
  byte bStack_1870;
  byte bStack_186f;
  byte bStack_186e;
  byte bStack_186c;
  byte bStack_186b;
  byte bStack_186a;
  short local_16d8;
  short sStack_16d6;
  short sStack_16d4;
  short sStack_16d2;
  short sStack_16d0;
  short sStack_16ce;
  short sStack_16cc;
  short sStack_16ca;
  short local_16b8;
  short sStack_16b6;
  short sStack_16b4;
  short sStack_16b2;
  short sStack_16b0;
  short sStack_16ae;
  short sStack_16ac;
  short sStack_16aa;
  ushort uStack_16a6;
  ushort uStack_16a4;
  ushort uStack_16a2;
  ushort uStack_169e;
  ushort uStack_169c;
  ushort uStack_169a;
  ushort uStack_1686;
  ushort uStack_1684;
  ushort uStack_1682;
  ushort uStack_167e;
  ushort uStack_167c;
  ushort uStack_167a;
  ushort uStack_1566;
  ushort uStack_1564;
  ushort uStack_1562;
  ushort uStack_155e;
  ushort uStack_155c;
  ushort uStack_155a;
  ushort uStack_1546;
  ushort uStack_1544;
  ushort uStack_1542;
  ushort uStack_153e;
  ushort uStack_153c;
  ushort uStack_153a;
  short local_1458;
  short sStack_1456;
  short sStack_1454;
  short sStack_1452;
  short sStack_1450;
  short sStack_144e;
  short sStack_144c;
  short sStack_144a;
  short local_1438;
  short sStack_1436;
  short sStack_1434;
  short sStack_1432;
  short sStack_1430;
  short sStack_142e;
  short sStack_142c;
  short sStack_142a;
  ushort uStack_1426;
  ushort uStack_1424;
  ushort uStack_1422;
  ushort uStack_141e;
  ushort uStack_141c;
  ushort uStack_141a;
  ushort uStack_1406;
  ushort uStack_1404;
  ushort uStack_1402;
  ushort uStack_13fe;
  ushort uStack_13fc;
  ushort uStack_13fa;
  ushort uStack_12e6;
  ushort uStack_12e4;
  ushort uStack_12e2;
  ushort uStack_12de;
  ushort uStack_12dc;
  ushort uStack_12da;
  ushort uStack_12c6;
  ushort uStack_12c4;
  ushort uStack_12c2;
  ushort uStack_12be;
  ushort uStack_12bc;
  ushort uStack_12ba;
  ushort uStack_11e6;
  ushort uStack_11e4;
  ushort uStack_11e2;
  ushort uStack_11de;
  ushort uStack_11dc;
  ushort uStack_11da;
  short local_11d8;
  short sStack_11d6;
  short sStack_11d4;
  short sStack_11d2;
  short sStack_11d0;
  short sStack_11ce;
  short sStack_11cc;
  short sStack_11ca;
  ushort uStack_11c6;
  ushort uStack_11c4;
  ushort uStack_11c2;
  ushort uStack_11be;
  ushort uStack_11bc;
  ushort uStack_11ba;
  short local_11b8;
  short sStack_11b6;
  short sStack_11b4;
  short sStack_11b2;
  short sStack_11b0;
  short sStack_11ae;
  short sStack_11ac;
  short sStack_11aa;
  ushort uStack_11a6;
  ushort uStack_11a4;
  ushort uStack_11a2;
  ushort uStack_119e;
  ushort uStack_119c;
  ushort uStack_119a;
  ushort uStack_1186;
  ushort uStack_1184;
  ushort uStack_1182;
  ushort uStack_117e;
  ushort uStack_117c;
  ushort uStack_117a;
  ushort uStack_1166;
  ushort uStack_1164;
  ushort uStack_1162;
  ushort uStack_115e;
  ushort uStack_115c;
  ushort uStack_115a;
  ushort uStack_1156;
  ushort uStack_1154;
  ushort uStack_1152;
  ushort uStack_114e;
  ushort uStack_114c;
  ushort uStack_114a;
  ushort uStack_1146;
  ushort uStack_1144;
  ushort uStack_1142;
  ushort uStack_113e;
  ushort uStack_113c;
  ushort uStack_113a;
  ushort uStack_1136;
  ushort uStack_1134;
  ushort uStack_1132;
  ushort uStack_112e;
  ushort uStack_112c;
  ushort uStack_112a;
  ushort uStack_1126;
  ushort uStack_1124;
  ushort uStack_1122;
  ushort uStack_111e;
  ushort uStack_111c;
  ushort uStack_111a;
  ushort uStack_1116;
  ushort uStack_1114;
  ushort uStack_1112;
  ushort uStack_110e;
  ushort uStack_110c;
  ushort uStack_110a;
  ushort uStack_1106;
  ushort uStack_1104;
  ushort uStack_1102;
  ushort uStack_10fe;
  ushort uStack_10fc;
  ushort uStack_10fa;
  ushort uStack_10f6;
  ushort uStack_10f4;
  ushort uStack_10f2;
  ushort uStack_10ee;
  ushort uStack_10ec;
  ushort uStack_10ea;
  ushort uStack_10e6;
  ushort uStack_10e4;
  ushort uStack_10e2;
  ushort uStack_10de;
  ushort uStack_10dc;
  ushort uStack_10da;
  ushort uStack_10d6;
  ushort uStack_10d4;
  ushort uStack_10d2;
  ushort uStack_10ce;
  ushort uStack_10cc;
  ushort uStack_10ca;
  ushort uStack_10c6;
  ushort uStack_10c4;
  ushort uStack_10c2;
  ushort uStack_10be;
  ushort uStack_10bc;
  ushort uStack_10ba;
  ushort uStack_10b6;
  ushort uStack_10b4;
  ushort uStack_10b2;
  ushort uStack_10ae;
  ushort uStack_10ac;
  ushort uStack_10aa;
  ushort uStack_10a6;
  ushort uStack_10a4;
  ushort uStack_10a2;
  ushort uStack_109e;
  ushort uStack_109c;
  ushort uStack_109a;
  ushort uStack_1086;
  ushort uStack_1084;
  ushort uStack_1082;
  ushort uStack_107e;
  ushort uStack_107c;
  ushort uStack_107a;
  ushort uStack_1066;
  ushort uStack_1064;
  ushort uStack_1062;
  ushort uStack_105e;
  ushort uStack_105c;
  ushort uStack_105a;
  ushort uStack_1056;
  ushort uStack_1054;
  ushort uStack_1052;
  ushort uStack_104e;
  ushort uStack_104c;
  ushort uStack_104a;
  ushort uStack_1046;
  ushort uStack_1044;
  ushort uStack_1042;
  ushort uStack_103e;
  ushort uStack_103c;
  ushort uStack_103a;
  ushort uStack_1036;
  ushort uStack_1034;
  ushort uStack_1032;
  ushort uStack_102e;
  ushort uStack_102c;
  ushort uStack_102a;
  ushort uStack_1026;
  ushort uStack_1024;
  ushort uStack_1022;
  ushort uStack_101e;
  ushort uStack_101c;
  ushort uStack_101a;
  ushort uStack_1016;
  ushort uStack_1014;
  ushort uStack_1012;
  ushort uStack_100e;
  ushort uStack_100c;
  ushort uStack_100a;
  ushort uStack_1006;
  ushort uStack_1004;
  ushort uStack_1002;
  ushort uStack_ffe;
  ushort uStack_ffc;
  ushort uStack_ffa;
  ushort uStack_ff6;
  ushort uStack_ff4;
  ushort uStack_ff2;
  ushort uStack_fee;
  ushort uStack_fec;
  ushort uStack_fea;
  ushort uStack_fe6;
  ushort uStack_fe4;
  ushort uStack_fe2;
  ushort uStack_fde;
  ushort uStack_fdc;
  ushort uStack_fda;
  ushort uStack_fd6;
  ushort uStack_fd4;
  ushort uStack_fd2;
  ushort uStack_fce;
  ushort uStack_fcc;
  ushort uStack_fca;
  ushort uStack_fc6;
  ushort uStack_fc4;
  ushort uStack_fc2;
  ushort uStack_fbe;
  ushort uStack_fbc;
  ushort uStack_fba;
  ushort uStack_fb6;
  ushort uStack_fb4;
  ushort uStack_fb2;
  ushort uStack_fae;
  ushort uStack_fac;
  ushort uStack_faa;
  ushort uStack_fa6;
  ushort uStack_fa4;
  ushort uStack_fa2;
  ushort uStack_f9e;
  ushort uStack_f9c;
  ushort uStack_f9a;
  short local_f98;
  short sStack_f96;
  short sStack_f94;
  short sStack_f92;
  short sStack_f90;
  short sStack_f8e;
  short sStack_f8c;
  short sStack_f8a;
  ushort uStack_f86;
  ushort uStack_f84;
  ushort uStack_f82;
  ushort uStack_f7e;
  ushort uStack_f7c;
  ushort uStack_f7a;
  short local_f78;
  short sStack_f76;
  short sStack_f74;
  short sStack_f72;
  short sStack_f70;
  short sStack_f6e;
  short sStack_f6c;
  short sStack_f6a;
  ushort uStack_f66;
  ushort uStack_f64;
  ushort uStack_f62;
  ushort uStack_f5e;
  ushort uStack_f5c;
  ushort uStack_f5a;
  ushort uStack_f46;
  ushort uStack_f44;
  ushort uStack_f42;
  ushort uStack_f3e;
  ushort uStack_f3c;
  ushort uStack_f3a;
  ushort uStack_f26;
  ushort uStack_f24;
  ushort uStack_f22;
  ushort uStack_f1e;
  ushort uStack_f1c;
  ushort uStack_f1a;
  ushort uStack_f16;
  ushort uStack_f14;
  ushort uStack_f12;
  ushort uStack_f0e;
  ushort uStack_f0c;
  ushort uStack_f0a;
  ushort uStack_f06;
  ushort uStack_f04;
  ushort uStack_f02;
  ushort uStack_efe;
  ushort uStack_efc;
  ushort uStack_efa;
  ushort uStack_ef6;
  ushort uStack_ef4;
  ushort uStack_ef2;
  ushort uStack_eee;
  ushort uStack_eec;
  ushort uStack_eea;
  ushort uStack_ee6;
  ushort uStack_ee4;
  ushort uStack_ee2;
  ushort uStack_ede;
  ushort uStack_edc;
  ushort uStack_eda;
  ushort uStack_ed6;
  ushort uStack_ed4;
  ushort uStack_ed2;
  ushort uStack_ece;
  ushort uStack_ecc;
  ushort uStack_eca;
  ushort uStack_ec6;
  ushort uStack_ec4;
  ushort uStack_ec2;
  ushort uStack_ebe;
  ushort uStack_ebc;
  ushort uStack_eba;
  ushort uStack_eb6;
  ushort uStack_eb4;
  ushort uStack_eb2;
  ushort uStack_eae;
  ushort uStack_eac;
  ushort uStack_eaa;
  ushort uStack_ea6;
  ushort uStack_ea4;
  ushort uStack_ea2;
  ushort uStack_e9e;
  ushort uStack_e9c;
  ushort uStack_e9a;
  ushort uStack_e96;
  ushort uStack_e94;
  ushort uStack_e92;
  ushort uStack_e8e;
  ushort uStack_e8c;
  ushort uStack_e8a;
  ushort uStack_e86;
  ushort uStack_e84;
  ushort uStack_e82;
  ushort uStack_e7e;
  ushort uStack_e7c;
  ushort uStack_e7a;
  ushort uStack_e76;
  ushort uStack_e74;
  ushort uStack_e72;
  ushort uStack_e6e;
  ushort uStack_e6c;
  ushort uStack_e6a;
  ushort uStack_e66;
  ushort uStack_e64;
  ushort uStack_e62;
  ushort uStack_e5e;
  ushort uStack_e5c;
  ushort uStack_e5a;
  ushort uStack_e46;
  ushort uStack_e44;
  ushort uStack_e42;
  ushort uStack_e3e;
  ushort uStack_e3c;
  ushort uStack_e3a;
  ushort uStack_e26;
  ushort uStack_e24;
  ushort uStack_e22;
  ushort uStack_e1e;
  ushort uStack_e1c;
  ushort uStack_e1a;
  ushort uStack_e16;
  ushort uStack_e14;
  ushort uStack_e12;
  ushort uStack_e0e;
  ushort uStack_e0c;
  ushort uStack_e0a;
  ushort uStack_e06;
  ushort uStack_e04;
  ushort uStack_e02;
  ushort uStack_dfe;
  ushort uStack_dfc;
  ushort uStack_dfa;
  ushort uStack_df6;
  ushort uStack_df4;
  ushort uStack_df2;
  ushort uStack_dee;
  ushort uStack_dec;
  ushort uStack_dea;
  ushort uStack_de6;
  ushort uStack_de4;
  ushort uStack_de2;
  ushort uStack_dde;
  ushort uStack_ddc;
  ushort uStack_dda;
  ushort uStack_dd6;
  ushort uStack_dd4;
  ushort uStack_dd2;
  ushort uStack_dce;
  ushort uStack_dcc;
  ushort uStack_dca;
  ushort uStack_dc6;
  ushort uStack_dc4;
  ushort uStack_dc2;
  ushort uStack_dbe;
  ushort uStack_dbc;
  ushort uStack_dba;
  ushort uStack_db6;
  ushort uStack_db4;
  ushort uStack_db2;
  ushort uStack_dae;
  ushort uStack_dac;
  ushort uStack_daa;
  ushort uStack_da6;
  ushort uStack_da4;
  ushort uStack_da2;
  ushort uStack_d9e;
  ushort uStack_d9c;
  ushort uStack_d9a;
  ushort uStack_d96;
  ushort uStack_d94;
  ushort uStack_d92;
  ushort uStack_d8e;
  ushort uStack_d8c;
  ushort uStack_d8a;
  ushort uStack_d86;
  ushort uStack_d84;
  ushort uStack_d82;
  ushort uStack_d7e;
  ushort uStack_d7c;
  ushort uStack_d7a;
  ushort uStack_d76;
  ushort uStack_d74;
  ushort uStack_d72;
  ushort uStack_d6e;
  ushort uStack_d6c;
  ushort uStack_d6a;
  ushort uStack_af6;
  ushort uStack_af4;
  ushort uStack_af2;
  ushort uStack_aee;
  ushort uStack_aec;
  ushort uStack_aea;
  ushort uStack_ad6;
  ushort uStack_ad4;
  ushort uStack_ad2;
  ushort uStack_ace;
  ushort uStack_acc;
  ushort uStack_aca;
  ushort uStack_ab6;
  ushort uStack_ab4;
  ushort uStack_ab2;
  ushort uStack_aae;
  ushort uStack_aac;
  ushort uStack_aaa;
  ushort uStack_a96;
  ushort uStack_a94;
  ushort uStack_a92;
  ushort uStack_a8e;
  ushort uStack_a8c;
  ushort uStack_a8a;
  ushort uStack_a76;
  ushort uStack_a74;
  ushort uStack_a72;
  ushort uStack_a6e;
  ushort uStack_a6c;
  ushort uStack_a6a;
  ushort uStack_a56;
  ushort uStack_a54;
  ushort uStack_a52;
  ushort uStack_a4e;
  ushort uStack_a4c;
  ushort uStack_a4a;
  ushort uStack_a36;
  ushort uStack_a34;
  ushort uStack_a32;
  ushort uStack_a2e;
  ushort uStack_a2c;
  ushort uStack_a2a;
  ushort uStack_a16;
  ushort uStack_a14;
  ushort uStack_a12;
  ushort uStack_a0e;
  ushort uStack_a0c;
  ushort uStack_a0a;
  ushort uStack_9f6;
  ushort uStack_9f4;
  ushort uStack_9f2;
  ushort uStack_9ee;
  ushort uStack_9ec;
  ushort uStack_9ea;
  ushort uStack_9d6;
  ushort uStack_9d4;
  ushort uStack_9d2;
  ushort uStack_9ce;
  ushort uStack_9cc;
  ushort uStack_9ca;
  ushort uStack_9b6;
  ushort uStack_9b4;
  ushort uStack_9b2;
  ushort uStack_9ae;
  ushort uStack_9ac;
  ushort uStack_9aa;
  ushort uStack_996;
  ushort uStack_994;
  ushort uStack_992;
  ushort uStack_98e;
  ushort uStack_98c;
  ushort uStack_98a;
  ushort uStack_976;
  ushort uStack_974;
  ushort uStack_972;
  ushort uStack_96e;
  ushort uStack_96c;
  ushort uStack_96a;
  ushort uStack_956;
  ushort uStack_954;
  ushort uStack_952;
  ushort uStack_94e;
  ushort uStack_94c;
  ushort uStack_94a;
  ushort uStack_936;
  ushort uStack_934;
  ushort uStack_932;
  ushort uStack_92e;
  ushort uStack_92c;
  ushort uStack_92a;
  ushort uStack_916;
  ushort uStack_914;
  ushort uStack_912;
  ushort uStack_90e;
  ushort uStack_90c;
  ushort uStack_90a;
  
  uVar28 = (ulong)yuv_type;
  pRVar27 = RGB2YUV + uVar28;
  for (rgb_ptr1._0_4_ = 0; (uint)rgb_ptr1 < height - 1; rgb_ptr1._0_4_ = (uint)rgb_ptr1 + 2) {
    rgb_ptr2 = RGBA + (uint)rgb_ptr1 * RGBA_stride;
    y_ptr1 = RGBA + ((uint)rgb_ptr1 + 1) * RGBA_stride;
    y_ptr2 = Y + (uint)rgb_ptr1 * Y_stride;
    u_ptr = Y + ((uint)rgb_ptr1 + 1) * Y_stride;
    v_ptr = U + ((uint)rgb_ptr1 >> 1) * UV_stride;
    local_2450 = V + ((uint)rgb_ptr1 >> 1) * UV_stride;
    for (rgb_ptr1._4_4_ = 0; rgb_ptr1._4_4_ < width - 0x1f; rgb_ptr1._4_4_ = rgb_ptr1._4_4_ + 0x20)
    {
      uVar4 = *(undefined8 *)rgb_ptr2;
      uVar5 = *(undefined8 *)(rgb_ptr2 + 8);
      uVar6 = *(undefined8 *)(rgb_ptr2 + 0x10);
      uVar7 = *(undefined8 *)(rgb_ptr2 + 0x18);
      uVar8 = *(undefined8 *)(rgb_ptr2 + 0x20);
      uVar9 = *(undefined8 *)(rgb_ptr2 + 0x28);
      uVar10 = *(undefined8 *)(rgb_ptr2 + 0x30);
      uVar11 = *(undefined8 *)(rgb_ptr2 + 0x38);
      uVar12 = *(undefined8 *)y_ptr1;
      uVar13 = *(undefined8 *)(y_ptr1 + 8);
      uVar14 = *(undefined8 *)(y_ptr1 + 0x10);
      uVar15 = *(undefined8 *)(y_ptr1 + 0x18);
      uVar16 = *(undefined8 *)(y_ptr1 + 0x20);
      uVar17 = *(undefined8 *)(y_ptr1 + 0x28);
      uVar18 = *(undefined8 *)(y_ptr1 + 0x30);
      uVar19 = *(undefined8 *)(y_ptr1 + 0x38);
      local_1e78 = (byte)uVar4;
      bStack_1e77 = (byte)((ulong)uVar4 >> 8);
      bStack_1e76 = (byte)((ulong)uVar4 >> 0x10);
      bStack_1e74 = (byte)((ulong)uVar4 >> 0x20);
      bStack_1e73 = (byte)((ulong)uVar4 >> 0x28);
      bStack_1e72 = (byte)((ulong)uVar4 >> 0x30);
      local_1e88 = (byte)uVar12;
      bStack_1e87 = (byte)((ulong)uVar12 >> 8);
      bStack_1e86 = (byte)((ulong)uVar12 >> 0x10);
      bStack_1e84 = (byte)((ulong)uVar12 >> 0x20);
      bStack_1e83 = (byte)((ulong)uVar12 >> 0x28);
      bStack_1e82 = (byte)((ulong)uVar12 >> 0x30);
      bStack_1870 = (byte)uVar5;
      bStack_186f = (byte)((ulong)uVar5 >> 8);
      bStack_186e = (byte)((ulong)uVar5 >> 0x10);
      bStack_186c = (byte)((ulong)uVar5 >> 0x20);
      bStack_186b = (byte)((ulong)uVar5 >> 0x28);
      bStack_186a = (byte)((ulong)uVar5 >> 0x30);
      bStack_1880 = (byte)uVar13;
      bStack_187f = (byte)((ulong)uVar13 >> 8);
      bStack_187e = (byte)((ulong)uVar13 >> 0x10);
      bStack_187c = (byte)((ulong)uVar13 >> 0x20);
      bStack_187b = (byte)((ulong)uVar13 >> 0x28);
      bStack_187a = (byte)((ulong)uVar13 >> 0x30);
      local_1e98 = (byte)uVar6;
      bStack_1e97 = (byte)((ulong)uVar6 >> 8);
      bStack_1e96 = (byte)((ulong)uVar6 >> 0x10);
      bStack_1e94 = (byte)((ulong)uVar6 >> 0x20);
      bStack_1e93 = (byte)((ulong)uVar6 >> 0x28);
      bStack_1e92 = (byte)((ulong)uVar6 >> 0x30);
      local_1ea8 = (byte)uVar14;
      bStack_1ea7 = (byte)((ulong)uVar14 >> 8);
      bStack_1ea6 = (byte)((ulong)uVar14 >> 0x10);
      bStack_1ea4 = (byte)((ulong)uVar14 >> 0x20);
      bStack_1ea3 = (byte)((ulong)uVar14 >> 0x28);
      bStack_1ea2 = (byte)((ulong)uVar14 >> 0x30);
      bStack_1890 = (byte)uVar7;
      bStack_188f = (byte)((ulong)uVar7 >> 8);
      bStack_188e = (byte)((ulong)uVar7 >> 0x10);
      bStack_188c = (byte)((ulong)uVar7 >> 0x20);
      bStack_188b = (byte)((ulong)uVar7 >> 0x28);
      bStack_188a = (byte)((ulong)uVar7 >> 0x30);
      bStack_18a0 = (byte)uVar15;
      bStack_189f = (byte)((ulong)uVar15 >> 8);
      bStack_189e = (byte)((ulong)uVar15 >> 0x10);
      bStack_189c = (byte)((ulong)uVar15 >> 0x20);
      bStack_189b = (byte)((ulong)uVar15 >> 0x28);
      bStack_189a = (byte)((ulong)uVar15 >> 0x30);
      local_1eb8 = (byte)uVar8;
      bStack_1eb7 = (byte)((ulong)uVar8 >> 8);
      bStack_1eb6 = (byte)((ulong)uVar8 >> 0x10);
      bStack_1eb4 = (byte)((ulong)uVar8 >> 0x20);
      bStack_1eb3 = (byte)((ulong)uVar8 >> 0x28);
      bStack_1eb2 = (byte)((ulong)uVar8 >> 0x30);
      local_1ec8 = (byte)uVar16;
      bStack_1ec7 = (byte)((ulong)uVar16 >> 8);
      bStack_1ec6 = (byte)((ulong)uVar16 >> 0x10);
      bStack_1ec4 = (byte)((ulong)uVar16 >> 0x20);
      bStack_1ec3 = (byte)((ulong)uVar16 >> 0x28);
      bStack_1ec2 = (byte)((ulong)uVar16 >> 0x30);
      bStack_18b0 = (byte)uVar9;
      bStack_18af = (byte)((ulong)uVar9 >> 8);
      bStack_18ae = (byte)((ulong)uVar9 >> 0x10);
      bStack_18ac = (byte)((ulong)uVar9 >> 0x20);
      bStack_18ab = (byte)((ulong)uVar9 >> 0x28);
      bStack_18aa = (byte)((ulong)uVar9 >> 0x30);
      bStack_18c0 = (byte)uVar17;
      bStack_18bf = (byte)((ulong)uVar17 >> 8);
      bStack_18be = (byte)((ulong)uVar17 >> 0x10);
      bStack_18bc = (byte)((ulong)uVar17 >> 0x20);
      bStack_18bb = (byte)((ulong)uVar17 >> 0x28);
      bStack_18ba = (byte)((ulong)uVar17 >> 0x30);
      local_1ed8 = (byte)uVar10;
      bStack_1ed7 = (byte)((ulong)uVar10 >> 8);
      bStack_1ed6 = (byte)((ulong)uVar10 >> 0x10);
      bStack_1ed4 = (byte)((ulong)uVar10 >> 0x20);
      bStack_1ed3 = (byte)((ulong)uVar10 >> 0x28);
      bStack_1ed2 = (byte)((ulong)uVar10 >> 0x30);
      local_1ee8 = (byte)uVar18;
      bStack_1ee7 = (byte)((ulong)uVar18 >> 8);
      bStack_1ee6 = (byte)((ulong)uVar18 >> 0x10);
      bStack_1ee4 = (byte)((ulong)uVar18 >> 0x20);
      bStack_1ee3 = (byte)((ulong)uVar18 >> 0x28);
      bStack_1ee2 = (byte)((ulong)uVar18 >> 0x30);
      bStack_18d0 = (byte)uVar11;
      bStack_18cf = (byte)((ulong)uVar11 >> 8);
      bStack_18ce = (byte)((ulong)uVar11 >> 0x10);
      bStack_18cc = (byte)((ulong)uVar11 >> 0x20);
      bStack_18cb = (byte)((ulong)uVar11 >> 0x28);
      bStack_18ca = (byte)((ulong)uVar11 >> 0x30);
      bStack_18e0 = (byte)uVar19;
      bStack_18df = (byte)((ulong)uVar19 >> 8);
      bStack_18de = (byte)((ulong)uVar19 >> 0x10);
      bStack_18dc = (byte)((ulong)uVar19 >> 0x20);
      bStack_18db = (byte)((ulong)uVar19 >> 0x28);
      bStack_18da = (byte)((ulong)uVar19 >> 0x30);
      bVar1 = pRVar27->r_factor;
      uStack_d76 = (ushort)bStack_1870;
      uStack_d74 = (ushort)local_1e98;
      uStack_d72 = (ushort)bStack_1890;
      uStack_d6e = (ushort)bStack_18b0;
      uStack_d6c = (ushort)local_1ed8;
      uStack_d6a = (ushort)bStack_18d0;
      uStack_d86 = (ushort)bVar1;
      uStack_d84 = (ushort)bVar1;
      uStack_d82 = (ushort)bVar1;
      uStack_d7e = (ushort)bVar1;
      uStack_d7c = (ushort)bVar1;
      uStack_d7a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_d96 = (ushort)bStack_186f;
      uStack_d94 = (ushort)bStack_1e97;
      uStack_d92 = (ushort)bStack_188f;
      uStack_d8e = (ushort)bStack_18af;
      uStack_d8c = (ushort)bStack_1ed7;
      uStack_d8a = (ushort)bStack_18cf;
      uStack_da6 = (ushort)bVar2;
      uStack_da4 = (ushort)bVar2;
      uStack_da2 = (ushort)bVar2;
      uStack_d9e = (ushort)bVar2;
      uStack_d9c = (ushort)bVar2;
      uStack_d9a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_db6 = (ushort)bStack_186e;
      uStack_db4 = (ushort)bStack_1e96;
      uStack_db2 = (ushort)bStack_188e;
      uStack_dae = (ushort)bStack_18ae;
      uStack_dac = (ushort)bStack_1ed6;
      uStack_daa = (ushort)bStack_18ce;
      uStack_dc6 = (ushort)bVar3;
      uStack_dc4 = (ushort)bVar3;
      uStack_dc2 = (ushort)bVar3;
      uStack_dbe = (ushort)bVar3;
      uStack_dbc = (ushort)bVar3;
      uStack_dba = (ushort)bVar3;
      uVar29 = (ushort)((ushort)local_1e78 * (ushort)bVar1 + (ushort)bStack_1e77 * (ushort)bVar2 +
                       (ushort)bStack_1e76 * (ushort)bVar3) >> 8;
      uVar33 = (ushort)(uStack_d76 * uStack_d86 + uStack_d96 * uStack_da6 + uStack_db6 * uStack_dc6)
               >> 8;
      uVar37 = (ushort)(uStack_d74 * uStack_d84 + uStack_d94 * uStack_da4 + uStack_db4 * uStack_dc4)
               >> 8;
      uVar41 = (ushort)(uStack_d72 * uStack_d82 + uStack_d92 * uStack_da2 + uStack_db2 * uStack_dc2)
               >> 8;
      uVar45 = (ushort)((ushort)local_1eb8 * (ushort)bVar1 + (ushort)bStack_1eb7 * (ushort)bVar2 +
                       (ushort)bStack_1eb6 * (ushort)bVar3) >> 8;
      uVar53 = (ushort)(uStack_d6e * uStack_d7e + uStack_d8e * uStack_d9e + uStack_dae * uStack_dbe)
               >> 8;
      uVar57 = (ushort)(uStack_d6c * uStack_d7c + uStack_d8c * uStack_d9c + uStack_dac * uStack_dbc)
               >> 8;
      uVar61 = (ushort)(uStack_d6a * uStack_d7a + uStack_d8a * uStack_d9a + uStack_daa * uStack_dba)
               >> 8;
      uStack_916 = (ushort)bStack_186e;
      uStack_914 = (ushort)bStack_1e96;
      uStack_912 = (ushort)bStack_188e;
      uStack_90e = (ushort)bStack_18ae;
      uStack_90c = (ushort)bStack_1ed6;
      uStack_90a = (ushort)bStack_18ce;
      uStack_936 = (ushort)bStack_1870;
      uStack_934 = (ushort)local_1e98;
      uStack_932 = (ushort)bStack_1890;
      uStack_92e = (ushort)bStack_18b0;
      uStack_92c = (ushort)local_1ed8;
      uStack_92a = (ushort)bStack_18d0;
      bVar1 = pRVar27->r_factor;
      uStack_dd6 = (ushort)bStack_186c;
      uStack_dd4 = (ushort)bStack_1e94;
      uStack_dd2 = (ushort)bStack_188c;
      uStack_dce = (ushort)bStack_18ac;
      uStack_dcc = (ushort)bStack_1ed4;
      uStack_dca = (ushort)bStack_18cc;
      uStack_de6 = (ushort)bVar1;
      uStack_de4 = (ushort)bVar1;
      uStack_de2 = (ushort)bVar1;
      uStack_dde = (ushort)bVar1;
      uStack_ddc = (ushort)bVar1;
      uStack_dda = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_df6 = (ushort)bStack_186b;
      uStack_df4 = (ushort)bStack_1e93;
      uStack_df2 = (ushort)bStack_188b;
      uStack_dee = (ushort)bStack_18ab;
      uStack_dec = (ushort)bStack_1ed3;
      uStack_dea = (ushort)bStack_18cb;
      uStack_e06 = (ushort)bVar2;
      uStack_e04 = (ushort)bVar2;
      uStack_e02 = (ushort)bVar2;
      uStack_dfe = (ushort)bVar2;
      uStack_dfc = (ushort)bVar2;
      uStack_dfa = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_e16 = (ushort)bStack_186a;
      uStack_e14 = (ushort)bStack_1e92;
      uStack_e12 = (ushort)bStack_188a;
      uStack_e0e = (ushort)bStack_18aa;
      uStack_e0c = (ushort)bStack_1ed2;
      uStack_e0a = (ushort)bStack_18ca;
      uStack_e26 = (ushort)bVar3;
      uStack_e24 = (ushort)bVar3;
      uStack_e22 = (ushort)bVar3;
      uStack_e1e = (ushort)bVar3;
      uStack_e1c = (ushort)bVar3;
      uStack_e1a = (ushort)bVar3;
      uVar30 = (ushort)((ushort)bStack_1e74 * (ushort)bVar1 + (ushort)bStack_1e73 * (ushort)bVar2 +
                       (ushort)bStack_1e72 * (ushort)bVar3) >> 8;
      uVar34 = (ushort)(uStack_dd6 * uStack_de6 + uStack_df6 * uStack_e06 + uStack_e16 * uStack_e26)
               >> 8;
      uVar38 = (ushort)(uStack_dd4 * uStack_de4 + uStack_df4 * uStack_e04 + uStack_e14 * uStack_e24)
               >> 8;
      uVar42 = (ushort)(uStack_dd2 * uStack_de2 + uStack_df2 * uStack_e02 + uStack_e12 * uStack_e22)
               >> 8;
      uVar46 = (ushort)((ushort)bStack_1eb4 * (ushort)bVar1 + (ushort)bStack_1eb3 * (ushort)bVar2 +
                       (ushort)bStack_1eb2 * (ushort)bVar3) >> 8;
      uVar54 = (ushort)(uStack_dce * uStack_dde + uStack_dee * uStack_dfe + uStack_e0e * uStack_e1e)
               >> 8;
      uVar58 = (ushort)(uStack_dcc * uStack_ddc + uStack_dec * uStack_dfc + uStack_e0c * uStack_e1c)
               >> 8;
      uVar62 = (ushort)(uStack_dca * uStack_dda + uStack_dea * uStack_dfa + uStack_e0a * uStack_e1a)
               >> 8;
      uStack_956 = (ushort)bStack_186a;
      uStack_954 = (ushort)bStack_1e92;
      uStack_952 = (ushort)bStack_188a;
      uStack_94e = (ushort)bStack_18aa;
      uStack_94c = (ushort)bStack_1ed2;
      uStack_94a = (ushort)bStack_18ca;
      uStack_976 = (ushort)bStack_186c;
      uStack_974 = (ushort)bStack_1e94;
      uStack_972 = (ushort)bStack_188c;
      uStack_96e = (ushort)bStack_18ac;
      uStack_96c = (ushort)bStack_1ed4;
      uStack_96a = (ushort)bStack_18cc;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_e46 = (ushort)bVar1;
      uStack_e44 = (ushort)bVar1;
      uStack_e42 = (ushort)bVar1;
      uStack_e3e = (ushort)bVar1;
      uStack_e3c = (ushort)bVar1;
      uStack_e3a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_12c6 = (ushort)bVar2;
      uStack_12c4 = (ushort)bVar2;
      uStack_12c2 = (ushort)bVar2;
      uStack_12be = (ushort)bVar2;
      uStack_12bc = (ushort)bVar2;
      uStack_12ba = (ushort)bVar2;
      uVar31 = ((ushort)(uVar29 * bVar1) >> 7) + (ushort)bVar2;
      uStack_12c6 = ((ushort)(uVar33 * uStack_e46) >> 7) + uStack_12c6;
      uStack_12c4 = ((ushort)(uVar37 * uStack_e44) >> 7) + uStack_12c4;
      uStack_12c2 = ((ushort)(uVar41 * uStack_e42) >> 7) + uStack_12c2;
      uVar47 = ((ushort)(uVar45 * bVar1) >> 7) + (ushort)bVar2;
      uStack_12be = ((ushort)(uVar53 * uStack_e3e) >> 7) + uStack_12be;
      uStack_12bc = ((ushort)(uVar57 * uStack_e3c) >> 7) + uStack_12bc;
      uStack_12ba = ((ushort)(uVar61 * uStack_e3a) >> 7) + uStack_12ba;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_e66 = (ushort)bVar1;
      uStack_e64 = (ushort)bVar1;
      uStack_e62 = (ushort)bVar1;
      uStack_e5e = (ushort)bVar1;
      uStack_e5c = (ushort)bVar1;
      uStack_e5a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_12e6 = (ushort)bVar2;
      uStack_12e4 = (ushort)bVar2;
      uStack_12e2 = (ushort)bVar2;
      uStack_12de = (ushort)bVar2;
      uStack_12dc = (ushort)bVar2;
      uStack_12da = (ushort)bVar2;
      uVar32 = ((ushort)(uVar30 * bVar1) >> 7) + (ushort)bVar2;
      uStack_12e6 = ((ushort)(uVar34 * uStack_e66) >> 7) + uStack_12e6;
      uStack_12e4 = ((ushort)(uVar38 * uStack_e64) >> 7) + uStack_12e4;
      uStack_12e2 = ((ushort)(uVar42 * uStack_e62) >> 7) + uStack_12e2;
      uVar48 = ((ushort)(uVar46 * bVar1) >> 7) + (ushort)bVar2;
      uStack_12de = ((ushort)(uVar54 * uStack_e5e) >> 7) + uStack_12de;
      uStack_12dc = ((ushort)(uVar58 * uStack_e5c) >> 7) + uStack_12dc;
      uStack_12da = ((ushort)(uVar62 * uStack_e5a) >> 7) + uStack_12da;
      *(ulong *)y_ptr2 =
           CONCAT17((uStack_12e2 != 0) * (uStack_12e2 < 0x100) * (char)uStack_12e2 -
                    (0xff < uStack_12e2),
                    CONCAT16((uStack_12c2 != 0) * (uStack_12c2 < 0x100) * (char)uStack_12c2 -
                             (0xff < uStack_12c2),
                             CONCAT15((uStack_12e4 != 0) * (uStack_12e4 < 0x100) * (char)uStack_12e4
                                      - (0xff < uStack_12e4),
                                      CONCAT14((uStack_12c4 != 0) * (uStack_12c4 < 0x100) *
                                               (char)uStack_12c4 - (0xff < uStack_12c4),
                                               CONCAT13((uStack_12e6 != 0) * (uStack_12e6 < 0x100) *
                                                        (char)uStack_12e6 - (0xff < uStack_12e6),
                                                        CONCAT12((uStack_12c6 != 0) *
                                                                 (uStack_12c6 < 0x100) *
                                                                 (char)uStack_12c6 -
                                                                 (0xff < uStack_12c6),
                                                                 CONCAT11((uVar32 != 0) *
                                                                          (uVar32 < 0x100) *
                                                                          (char)uVar32 -
                                                                          (0xff < uVar32),
                                                                          (uVar31 != 0) *
                                                                          (uVar31 < 0x100) *
                                                                          (char)uVar31 -
                                                                          (0xff < uVar31))))))));
      *(ulong *)(y_ptr2 + 8) =
           CONCAT17((uStack_12da != 0) * (uStack_12da < 0x100) * (char)uStack_12da -
                    (0xff < uStack_12da),
                    CONCAT16((uStack_12ba != 0) * (uStack_12ba < 0x100) * (char)uStack_12ba -
                             (0xff < uStack_12ba),
                             CONCAT15((uStack_12dc != 0) * (uStack_12dc < 0x100) * (char)uStack_12dc
                                      - (0xff < uStack_12dc),
                                      CONCAT14((uStack_12bc != 0) * (uStack_12bc < 0x100) *
                                               (char)uStack_12bc - (0xff < uStack_12bc),
                                               CONCAT13((uStack_12de != 0) * (uStack_12de < 0x100) *
                                                        (char)uStack_12de - (0xff < uStack_12de),
                                                        CONCAT12((uStack_12be != 0) *
                                                                 (uStack_12be < 0x100) *
                                                                 (char)uStack_12be -
                                                                 (0xff < uStack_12be),
                                                                 CONCAT11((uVar48 != 0) *
                                                                          (uVar48 < 0x100) *
                                                                          (char)uVar48 -
                                                                          (0xff < uVar48),
                                                                          (uVar47 != 0) *
                                                                          (uVar47 < 0x100) *
                                                                          (char)uVar47 -
                                                                          (0xff < uVar47))))))));
      bVar1 = pRVar27->r_factor;
      uStack_e76 = (ushort)bStack_1880;
      uStack_e74 = (ushort)local_1ea8;
      uStack_e72 = (ushort)bStack_18a0;
      uStack_e6e = (ushort)bStack_18c0;
      uStack_e6c = (ushort)local_1ee8;
      uStack_e6a = (ushort)bStack_18e0;
      uStack_e86 = (ushort)bVar1;
      uStack_e84 = (ushort)bVar1;
      uStack_e82 = (ushort)bVar1;
      uStack_e7e = (ushort)bVar1;
      uStack_e7c = (ushort)bVar1;
      uStack_e7a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_e96 = (ushort)bStack_187f;
      uStack_e94 = (ushort)bStack_1ea7;
      uStack_e92 = (ushort)bStack_189f;
      uStack_e8e = (ushort)bStack_18bf;
      uStack_e8c = (ushort)bStack_1ee7;
      uStack_e8a = (ushort)bStack_18df;
      uStack_ea6 = (ushort)bVar2;
      uStack_ea4 = (ushort)bVar2;
      uStack_ea2 = (ushort)bVar2;
      uStack_e9e = (ushort)bVar2;
      uStack_e9c = (ushort)bVar2;
      uStack_e9a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_eb6 = (ushort)bStack_187e;
      uStack_eb4 = (ushort)bStack_1ea6;
      uStack_eb2 = (ushort)bStack_189e;
      uStack_eae = (ushort)bStack_18be;
      uStack_eac = (ushort)bStack_1ee6;
      uStack_eaa = (ushort)bStack_18de;
      uStack_ec6 = (ushort)bVar3;
      uStack_ec4 = (ushort)bVar3;
      uStack_ec2 = (ushort)bVar3;
      uStack_ebe = (ushort)bVar3;
      uStack_ebc = (ushort)bVar3;
      uStack_eba = (ushort)bVar3;
      uVar31 = (ushort)((ushort)local_1e88 * (ushort)bVar1 + (ushort)bStack_1e87 * (ushort)bVar2 +
                       (ushort)bStack_1e86 * (ushort)bVar3) >> 8;
      uVar35 = (ushort)(uStack_e76 * uStack_e86 + uStack_e96 * uStack_ea6 + uStack_eb6 * uStack_ec6)
               >> 8;
      uVar39 = (ushort)(uStack_e74 * uStack_e84 + uStack_e94 * uStack_ea4 + uStack_eb4 * uStack_ec4)
               >> 8;
      uVar43 = (ushort)(uStack_e72 * uStack_e82 + uStack_e92 * uStack_ea2 + uStack_eb2 * uStack_ec2)
               >> 8;
      uVar49 = (ushort)((ushort)local_1ec8 * (ushort)bVar1 + (ushort)bStack_1ec7 * (ushort)bVar2 +
                       (ushort)bStack_1ec6 * (ushort)bVar3) >> 8;
      uVar55 = (ushort)(uStack_e6e * uStack_e7e + uStack_e8e * uStack_e9e + uStack_eae * uStack_ebe)
               >> 8;
      uVar59 = (ushort)(uStack_e6c * uStack_e7c + uStack_e8c * uStack_e9c + uStack_eac * uStack_ebc)
               >> 8;
      uVar63 = (ushort)(uStack_e6a * uStack_e7a + uStack_e8a * uStack_e9a + uStack_eaa * uStack_eba)
               >> 8;
      uStack_996 = (ushort)bStack_187e;
      uStack_994 = (ushort)bStack_1ea6;
      uStack_992 = (ushort)bStack_189e;
      uStack_98e = (ushort)bStack_18be;
      uStack_98c = (ushort)bStack_1ee6;
      uStack_98a = (ushort)bStack_18de;
      uStack_9b6 = (ushort)bStack_1880;
      uStack_9b4 = (ushort)local_1ea8;
      uStack_9b2 = (ushort)bStack_18a0;
      uStack_9ae = (ushort)bStack_18c0;
      uStack_9ac = (ushort)local_1ee8;
      uStack_9aa = (ushort)bStack_18e0;
      bVar1 = pRVar27->r_factor;
      uStack_ed6 = (ushort)bStack_187c;
      uStack_ed4 = (ushort)bStack_1ea4;
      uStack_ed2 = (ushort)bStack_189c;
      uStack_ece = (ushort)bStack_18bc;
      uStack_ecc = (ushort)bStack_1ee4;
      uStack_eca = (ushort)bStack_18dc;
      uStack_ee6 = (ushort)bVar1;
      uStack_ee4 = (ushort)bVar1;
      uStack_ee2 = (ushort)bVar1;
      uStack_ede = (ushort)bVar1;
      uStack_edc = (ushort)bVar1;
      uStack_eda = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_ef6 = (ushort)bStack_187b;
      uStack_ef4 = (ushort)bStack_1ea3;
      uStack_ef2 = (ushort)bStack_189b;
      uStack_eee = (ushort)bStack_18bb;
      uStack_eec = (ushort)bStack_1ee3;
      uStack_eea = (ushort)bStack_18db;
      uStack_f06 = (ushort)bVar2;
      uStack_f04 = (ushort)bVar2;
      uStack_f02 = (ushort)bVar2;
      uStack_efe = (ushort)bVar2;
      uStack_efc = (ushort)bVar2;
      uStack_efa = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_f16 = (ushort)bStack_187a;
      uStack_f14 = (ushort)bStack_1ea2;
      uStack_f12 = (ushort)bStack_189a;
      uStack_f0e = (ushort)bStack_18ba;
      uStack_f0c = (ushort)bStack_1ee2;
      uStack_f0a = (ushort)bStack_18da;
      uStack_f26 = (ushort)bVar3;
      uStack_f24 = (ushort)bVar3;
      uStack_f22 = (ushort)bVar3;
      uStack_f1e = (ushort)bVar3;
      uStack_f1c = (ushort)bVar3;
      uStack_f1a = (ushort)bVar3;
      uVar32 = (ushort)((ushort)bStack_1e84 * (ushort)bVar1 + (ushort)bStack_1e83 * (ushort)bVar2 +
                       (ushort)bStack_1e82 * (ushort)bVar3) >> 8;
      uVar36 = (ushort)(uStack_ed6 * uStack_ee6 + uStack_ef6 * uStack_f06 + uStack_f16 * uStack_f26)
               >> 8;
      uVar40 = (ushort)(uStack_ed4 * uStack_ee4 + uStack_ef4 * uStack_f04 + uStack_f14 * uStack_f24)
               >> 8;
      uVar44 = (ushort)(uStack_ed2 * uStack_ee2 + uStack_ef2 * uStack_f02 + uStack_f12 * uStack_f22)
               >> 8;
      uVar50 = (ushort)((ushort)bStack_1ec4 * (ushort)bVar1 + (ushort)bStack_1ec3 * (ushort)bVar2 +
                       (ushort)bStack_1ec2 * (ushort)bVar3) >> 8;
      uVar56 = (ushort)(uStack_ece * uStack_ede + uStack_eee * uStack_efe + uStack_f0e * uStack_f1e)
               >> 8;
      uVar60 = (ushort)(uStack_ecc * uStack_edc + uStack_eec * uStack_efc + uStack_f0c * uStack_f1c)
               >> 8;
      uVar64 = (ushort)(uStack_eca * uStack_eda + uStack_eea * uStack_efa + uStack_f0a * uStack_f1a)
               >> 8;
      uStack_9d6 = (ushort)bStack_187a;
      uStack_9d4 = (ushort)bStack_1ea2;
      uStack_9d2 = (ushort)bStack_189a;
      uStack_9ce = (ushort)bStack_18ba;
      uStack_9cc = (ushort)bStack_1ee2;
      uStack_9ca = (ushort)bStack_18da;
      uStack_9f6 = (ushort)bStack_187c;
      uStack_9f4 = (ushort)bStack_1ea4;
      uStack_9f2 = (ushort)bStack_189c;
      uStack_9ee = (ushort)bStack_18bc;
      uStack_9ec = (ushort)bStack_1ee4;
      uStack_9ea = (ushort)bStack_18dc;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_f46 = (ushort)bVar1;
      uStack_f44 = (ushort)bVar1;
      uStack_f42 = (ushort)bVar1;
      uStack_f3e = (ushort)bVar1;
      uStack_f3c = (ushort)bVar1;
      uStack_f3a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_1406 = (ushort)bVar2;
      uStack_1404 = (ushort)bVar2;
      uStack_1402 = (ushort)bVar2;
      uStack_13fe = (ushort)bVar2;
      uStack_13fc = (ushort)bVar2;
      uStack_13fa = (ushort)bVar2;
      uVar47 = ((ushort)(uVar31 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1406 = ((ushort)(uVar35 * uStack_f46) >> 7) + uStack_1406;
      uStack_1404 = ((ushort)(uVar39 * uStack_f44) >> 7) + uStack_1404;
      uStack_1402 = ((ushort)(uVar43 * uStack_f42) >> 7) + uStack_1402;
      uVar51 = ((ushort)(uVar49 * bVar1) >> 7) + (ushort)bVar2;
      uStack_13fe = ((ushort)(uVar55 * uStack_f3e) >> 7) + uStack_13fe;
      uStack_13fc = ((ushort)(uVar59 * uStack_f3c) >> 7) + uStack_13fc;
      uStack_13fa = ((ushort)(uVar63 * uStack_f3a) >> 7) + uStack_13fa;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_f66 = (ushort)bVar1;
      uStack_f64 = (ushort)bVar1;
      uStack_f62 = (ushort)bVar1;
      uStack_f5e = (ushort)bVar1;
      uStack_f5c = (ushort)bVar1;
      uStack_f5a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_1426 = (ushort)bVar2;
      uStack_1424 = (ushort)bVar2;
      uStack_1422 = (ushort)bVar2;
      uStack_141e = (ushort)bVar2;
      uStack_141c = (ushort)bVar2;
      uStack_141a = (ushort)bVar2;
      uVar48 = ((ushort)(uVar32 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1426 = ((ushort)(uVar36 * uStack_f66) >> 7) + uStack_1426;
      uStack_1424 = ((ushort)(uVar40 * uStack_f64) >> 7) + uStack_1424;
      uStack_1422 = ((ushort)(uVar44 * uStack_f62) >> 7) + uStack_1422;
      uVar52 = ((ushort)(uVar50 * bVar1) >> 7) + (ushort)bVar2;
      uStack_141e = ((ushort)(uVar56 * uStack_f5e) >> 7) + uStack_141e;
      uStack_141c = ((ushort)(uVar60 * uStack_f5c) >> 7) + uStack_141c;
      uStack_141a = ((ushort)(uVar64 * uStack_f5a) >> 7) + uStack_141a;
      *(ulong *)u_ptr =
           CONCAT17((uStack_1422 != 0) * (uStack_1422 < 0x100) * (char)uStack_1422 -
                    (0xff < uStack_1422),
                    CONCAT16((uStack_1402 != 0) * (uStack_1402 < 0x100) * (char)uStack_1402 -
                             (0xff < uStack_1402),
                             CONCAT15((uStack_1424 != 0) * (uStack_1424 < 0x100) * (char)uStack_1424
                                      - (0xff < uStack_1424),
                                      CONCAT14((uStack_1404 != 0) * (uStack_1404 < 0x100) *
                                               (char)uStack_1404 - (0xff < uStack_1404),
                                               CONCAT13((uStack_1426 != 0) * (uStack_1426 < 0x100) *
                                                        (char)uStack_1426 - (0xff < uStack_1426),
                                                        CONCAT12((uStack_1406 != 0) *
                                                                 (uStack_1406 < 0x100) *
                                                                 (char)uStack_1406 -
                                                                 (0xff < uStack_1406),
                                                                 CONCAT11((uVar48 != 0) *
                                                                          (uVar48 < 0x100) *
                                                                          (char)uVar48 -
                                                                          (0xff < uVar48),
                                                                          (uVar47 != 0) *
                                                                          (uVar47 < 0x100) *
                                                                          (char)uVar47 -
                                                                          (0xff < uVar47))))))));
      *(ulong *)(u_ptr + 8) =
           CONCAT17((uStack_141a != 0) * (uStack_141a < 0x100) * (char)uStack_141a -
                    (0xff < uStack_141a),
                    CONCAT16((uStack_13fa != 0) * (uStack_13fa < 0x100) * (char)uStack_13fa -
                             (0xff < uStack_13fa),
                             CONCAT15((uStack_141c != 0) * (uStack_141c < 0x100) * (char)uStack_141c
                                      - (0xff < uStack_141c),
                                      CONCAT14((uStack_13fc != 0) * (uStack_13fc < 0x100) *
                                               (char)uStack_13fc - (0xff < uStack_13fc),
                                               CONCAT13((uStack_141e != 0) * (uStack_141e < 0x100) *
                                                        (char)uStack_141e - (0xff < uStack_141e),
                                                        CONCAT12((uStack_13fe != 0) *
                                                                 (uStack_13fe < 0x100) *
                                                                 (char)uStack_13fe -
                                                                 (0xff < uStack_13fe),
                                                                 CONCAT11((uVar52 != 0) *
                                                                          (uVar52 < 0x100) *
                                                                          (char)uVar52 -
                                                                          (0xff < uVar52),
                                                                          (uVar51 != 0) *
                                                                          (uVar51 < 0x100) *
                                                                          (char)uVar51 -
                                                                          (0xff < uVar51))))))));
      auVar26._2_2_ =
           (uStack_916 - uVar33) + (uStack_956 - uVar34) + (uStack_996 - uVar35) +
           (uStack_9d6 - uVar36);
      auVar26._0_2_ =
           (bStack_1e76 - uVar29) + (bStack_1e72 - uVar30) + (bStack_1e86 - uVar31) +
           (bStack_1e82 - uVar32);
      auVar26._4_2_ =
           (uStack_914 - uVar37) + (uStack_954 - uVar38) + (uStack_994 - uVar39) +
           (uStack_9d4 - uVar40);
      auVar26._6_2_ =
           (uStack_912 - uVar41) + (uStack_952 - uVar42) + (uStack_992 - uVar43) +
           (uStack_9d2 - uVar44);
      auVar26._10_2_ =
           (uStack_90e - uVar53) + (uStack_94e - uVar54) + (uStack_98e - uVar55) +
           (uStack_9ce - uVar56);
      auVar26._8_2_ =
           (bStack_1eb6 - uVar45) + (bStack_1eb2 - uVar46) + (bStack_1ec6 - uVar49) +
           (bStack_1ec2 - uVar50);
      auVar26._12_2_ =
           (uStack_90c - uVar57) + (uStack_94c - uVar58) + (uStack_98c - uVar59) +
           (uStack_9cc - uVar60);
      auVar26._14_2_ =
           (uStack_90a - uVar61) + (uStack_94a - uVar62) + (uStack_98a - uVar63) +
           (uStack_9ca - uVar64);
      auVar65 = psraw(auVar26,ZEXT416(2));
      bVar1 = RGB2YUV[uVar28].cb_factor;
      local_f78 = auVar65._0_2_;
      sStack_f76 = auVar65._2_2_;
      sStack_f74 = auVar65._4_2_;
      sStack_f72 = auVar65._6_2_;
      sStack_f70 = auVar65._8_2_;
      sStack_f6e = auVar65._10_2_;
      sStack_f6c = auVar65._12_2_;
      sStack_f6a = auVar65._14_2_;
      uStack_f86 = (ushort)bVar1;
      uStack_f84 = (ushort)bVar1;
      uStack_f82 = (ushort)bVar1;
      uStack_f7e = (ushort)bVar1;
      uStack_f7c = (ushort)bVar1;
      uStack_f7a = (ushort)bVar1;
      auVar25._2_2_ = sStack_f76 * uStack_f86;
      auVar25._0_2_ = local_f78 * (ushort)bVar1;
      auVar25._4_2_ = sStack_f74 * uStack_f84;
      auVar25._6_2_ = sStack_f72 * uStack_f82;
      auVar25._8_2_ = sStack_f70 * (ushort)bVar1;
      auVar25._10_2_ = sStack_f6e * uStack_f7e;
      auVar25._12_2_ = sStack_f6c * uStack_f7c;
      auVar25._14_2_ = sStack_f6a * uStack_f7a;
      auVar65 = psraw(auVar25,ZEXT416(8));
      local_1438 = auVar65._0_2_;
      sStack_1436 = auVar65._2_2_;
      sStack_1434 = auVar65._4_2_;
      sStack_1432 = auVar65._6_2_;
      sStack_1430 = auVar65._8_2_;
      sStack_142e = auVar65._10_2_;
      sStack_142c = auVar65._12_2_;
      sStack_142a = auVar65._14_2_;
      local_1438 = local_1438 + 0x80;
      sStack_1436 = sStack_1436 + 0x80;
      sStack_1434 = sStack_1434 + 0x80;
      sStack_1432 = sStack_1432 + 0x80;
      sStack_1430 = sStack_1430 + 0x80;
      sStack_142e = sStack_142e + 0x80;
      sStack_142c = sStack_142c + 0x80;
      sStack_142a = sStack_142a + 0x80;
      auVar24._2_2_ =
           (uStack_936 - uVar33) + (uStack_976 - uVar34) + (uStack_9b6 - uVar35) +
           (uStack_9f6 - uVar36);
      auVar24._0_2_ =
           (local_1e78 - uVar29) + (bStack_1e74 - uVar30) + (local_1e88 - uVar31) +
           (bStack_1e84 - uVar32);
      auVar24._4_2_ =
           (uStack_934 - uVar37) + (uStack_974 - uVar38) + (uStack_9b4 - uVar39) +
           (uStack_9f4 - uVar40);
      auVar24._6_2_ =
           (uStack_932 - uVar41) + (uStack_972 - uVar42) + (uStack_9b2 - uVar43) +
           (uStack_9f2 - uVar44);
      auVar24._10_2_ =
           (uStack_92e - uVar53) + (uStack_96e - uVar54) + (uStack_9ae - uVar55) +
           (uStack_9ee - uVar56);
      auVar24._8_2_ =
           (local_1eb8 - uVar45) + (bStack_1eb4 - uVar46) + (local_1ec8 - uVar49) +
           (bStack_1ec4 - uVar50);
      auVar24._12_2_ =
           (uStack_92c - uVar57) + (uStack_96c - uVar58) + (uStack_9ac - uVar59) +
           (uStack_9ec - uVar60);
      auVar24._14_2_ =
           (uStack_92a - uVar61) + (uStack_96a - uVar62) + (uStack_9aa - uVar63) +
           (uStack_9ea - uVar64);
      auVar65 = psraw(auVar24,ZEXT416(2));
      bVar1 = RGB2YUV[uVar28].cr_factor;
      local_f98 = auVar65._0_2_;
      sStack_f96 = auVar65._2_2_;
      sStack_f94 = auVar65._4_2_;
      sStack_f92 = auVar65._6_2_;
      sStack_f90 = auVar65._8_2_;
      sStack_f8e = auVar65._10_2_;
      sStack_f8c = auVar65._12_2_;
      sStack_f8a = auVar65._14_2_;
      uStack_fa6 = (ushort)bVar1;
      uStack_fa4 = (ushort)bVar1;
      uStack_fa2 = (ushort)bVar1;
      uStack_f9e = (ushort)bVar1;
      uStack_f9c = (ushort)bVar1;
      uStack_f9a = (ushort)bVar1;
      auVar23._2_2_ = sStack_f96 * uStack_fa6;
      auVar23._0_2_ = local_f98 * (ushort)bVar1;
      auVar23._4_2_ = sStack_f94 * uStack_fa4;
      auVar23._6_2_ = sStack_f92 * uStack_fa2;
      auVar23._8_2_ = sStack_f90 * (ushort)bVar1;
      auVar23._10_2_ = sStack_f8e * uStack_f9e;
      auVar23._12_2_ = sStack_f8c * uStack_f9c;
      auVar23._14_2_ = sStack_f8a * uStack_f9a;
      auVar65 = psraw(auVar23,ZEXT416(8));
      local_1458 = auVar65._0_2_;
      sStack_1456 = auVar65._2_2_;
      sStack_1454 = auVar65._4_2_;
      sStack_1452 = auVar65._6_2_;
      sStack_1450 = auVar65._8_2_;
      sStack_144e = auVar65._10_2_;
      sStack_144c = auVar65._12_2_;
      sStack_144a = auVar65._14_2_;
      local_1458 = local_1458 + 0x80;
      sStack_1456 = sStack_1456 + 0x80;
      sStack_1454 = sStack_1454 + 0x80;
      sStack_1452 = sStack_1452 + 0x80;
      sStack_1450 = sStack_1450 + 0x80;
      sStack_144e = sStack_144e + 0x80;
      sStack_144c = sStack_144c + 0x80;
      sStack_144a = sStack_144a + 0x80;
      uVar4 = *(undefined8 *)(rgb_ptr2 + 0x40);
      uVar5 = *(undefined8 *)(rgb_ptr2 + 0x48);
      uVar6 = *(undefined8 *)(rgb_ptr2 + 0x50);
      uVar7 = *(undefined8 *)(rgb_ptr2 + 0x58);
      uVar8 = *(undefined8 *)(rgb_ptr2 + 0x60);
      uVar9 = *(undefined8 *)(rgb_ptr2 + 0x68);
      uVar10 = *(undefined8 *)(rgb_ptr2 + 0x70);
      uVar11 = *(undefined8 *)(rgb_ptr2 + 0x78);
      uVar12 = *(undefined8 *)(y_ptr1 + 0x40);
      uVar13 = *(undefined8 *)(y_ptr1 + 0x48);
      uVar14 = *(undefined8 *)(y_ptr1 + 0x50);
      uVar15 = *(undefined8 *)(y_ptr1 + 0x58);
      uVar16 = *(undefined8 *)(y_ptr1 + 0x60);
      uVar17 = *(undefined8 *)(y_ptr1 + 0x68);
      uVar18 = *(undefined8 *)(y_ptr1 + 0x70);
      uVar19 = *(undefined8 *)(y_ptr1 + 0x78);
      local_2138 = (byte)uVar4;
      bStack_2137 = (byte)((ulong)uVar4 >> 8);
      bStack_2136 = (byte)((ulong)uVar4 >> 0x10);
      bStack_2134 = (byte)((ulong)uVar4 >> 0x20);
      bStack_2133 = (byte)((ulong)uVar4 >> 0x28);
      bStack_2132 = (byte)((ulong)uVar4 >> 0x30);
      local_2148 = (byte)uVar12;
      bStack_2147 = (byte)((ulong)uVar12 >> 8);
      bStack_2146 = (byte)((ulong)uVar12 >> 0x10);
      bStack_2144 = (byte)((ulong)uVar12 >> 0x20);
      bStack_2143 = (byte)((ulong)uVar12 >> 0x28);
      bStack_2142 = (byte)((ulong)uVar12 >> 0x30);
      bStack_1b70 = (byte)uVar5;
      bStack_1b6f = (byte)((ulong)uVar5 >> 8);
      bStack_1b6e = (byte)((ulong)uVar5 >> 0x10);
      bStack_1b6c = (byte)((ulong)uVar5 >> 0x20);
      bStack_1b6b = (byte)((ulong)uVar5 >> 0x28);
      bStack_1b6a = (byte)((ulong)uVar5 >> 0x30);
      bStack_1b80 = (byte)uVar13;
      bStack_1b7f = (byte)((ulong)uVar13 >> 8);
      bStack_1b7e = (byte)((ulong)uVar13 >> 0x10);
      bStack_1b7c = (byte)((ulong)uVar13 >> 0x20);
      bStack_1b7b = (byte)((ulong)uVar13 >> 0x28);
      bStack_1b7a = (byte)((ulong)uVar13 >> 0x30);
      local_2158 = (byte)uVar6;
      bStack_2157 = (byte)((ulong)uVar6 >> 8);
      bStack_2156 = (byte)((ulong)uVar6 >> 0x10);
      bStack_2154 = (byte)((ulong)uVar6 >> 0x20);
      bStack_2153 = (byte)((ulong)uVar6 >> 0x28);
      bStack_2152 = (byte)((ulong)uVar6 >> 0x30);
      local_2168 = (byte)uVar14;
      bStack_2167 = (byte)((ulong)uVar14 >> 8);
      bStack_2166 = (byte)((ulong)uVar14 >> 0x10);
      bStack_2164 = (byte)((ulong)uVar14 >> 0x20);
      bStack_2163 = (byte)((ulong)uVar14 >> 0x28);
      bStack_2162 = (byte)((ulong)uVar14 >> 0x30);
      bStack_1b90 = (byte)uVar7;
      bStack_1b8f = (byte)((ulong)uVar7 >> 8);
      bStack_1b8e = (byte)((ulong)uVar7 >> 0x10);
      bStack_1b8c = (byte)((ulong)uVar7 >> 0x20);
      bStack_1b8b = (byte)((ulong)uVar7 >> 0x28);
      bStack_1b8a = (byte)((ulong)uVar7 >> 0x30);
      bStack_1ba0 = (byte)uVar15;
      bStack_1b9f = (byte)((ulong)uVar15 >> 8);
      bStack_1b9e = (byte)((ulong)uVar15 >> 0x10);
      bStack_1b9c = (byte)((ulong)uVar15 >> 0x20);
      bStack_1b9b = (byte)((ulong)uVar15 >> 0x28);
      bStack_1b9a = (byte)((ulong)uVar15 >> 0x30);
      local_2178 = (byte)uVar8;
      bStack_2177 = (byte)((ulong)uVar8 >> 8);
      bStack_2176 = (byte)((ulong)uVar8 >> 0x10);
      bStack_2174 = (byte)((ulong)uVar8 >> 0x20);
      bStack_2173 = (byte)((ulong)uVar8 >> 0x28);
      bStack_2172 = (byte)((ulong)uVar8 >> 0x30);
      local_2188 = (byte)uVar16;
      bStack_2187 = (byte)((ulong)uVar16 >> 8);
      bStack_2186 = (byte)((ulong)uVar16 >> 0x10);
      bStack_2184 = (byte)((ulong)uVar16 >> 0x20);
      bStack_2183 = (byte)((ulong)uVar16 >> 0x28);
      bStack_2182 = (byte)((ulong)uVar16 >> 0x30);
      bStack_1bb0 = (byte)uVar9;
      bStack_1baf = (byte)((ulong)uVar9 >> 8);
      bStack_1bae = (byte)((ulong)uVar9 >> 0x10);
      bStack_1bac = (byte)((ulong)uVar9 >> 0x20);
      bStack_1bab = (byte)((ulong)uVar9 >> 0x28);
      bStack_1baa = (byte)((ulong)uVar9 >> 0x30);
      bStack_1bc0 = (byte)uVar17;
      bStack_1bbf = (byte)((ulong)uVar17 >> 8);
      bStack_1bbe = (byte)((ulong)uVar17 >> 0x10);
      bStack_1bbc = (byte)((ulong)uVar17 >> 0x20);
      bStack_1bbb = (byte)((ulong)uVar17 >> 0x28);
      bStack_1bba = (byte)((ulong)uVar17 >> 0x30);
      local_2198 = (byte)uVar10;
      bStack_2197 = (byte)((ulong)uVar10 >> 8);
      bStack_2196 = (byte)((ulong)uVar10 >> 0x10);
      bStack_2194 = (byte)((ulong)uVar10 >> 0x20);
      bStack_2193 = (byte)((ulong)uVar10 >> 0x28);
      bStack_2192 = (byte)((ulong)uVar10 >> 0x30);
      local_21a8 = (byte)uVar18;
      bStack_21a7 = (byte)((ulong)uVar18 >> 8);
      bStack_21a6 = (byte)((ulong)uVar18 >> 0x10);
      bStack_21a4 = (byte)((ulong)uVar18 >> 0x20);
      bStack_21a3 = (byte)((ulong)uVar18 >> 0x28);
      bStack_21a2 = (byte)((ulong)uVar18 >> 0x30);
      bStack_1bd0 = (byte)uVar11;
      bStack_1bcf = (byte)((ulong)uVar11 >> 8);
      bStack_1bce = (byte)((ulong)uVar11 >> 0x10);
      bStack_1bcc = (byte)((ulong)uVar11 >> 0x20);
      bStack_1bcb = (byte)((ulong)uVar11 >> 0x28);
      bStack_1bca = (byte)((ulong)uVar11 >> 0x30);
      bStack_1be0 = (byte)uVar19;
      bStack_1bdf = (byte)((ulong)uVar19 >> 8);
      bStack_1bde = (byte)((ulong)uVar19 >> 0x10);
      bStack_1bdc = (byte)((ulong)uVar19 >> 0x20);
      bStack_1bdb = (byte)((ulong)uVar19 >> 0x28);
      bStack_1bda = (byte)((ulong)uVar19 >> 0x30);
      bVar1 = pRVar27->r_factor;
      uStack_fb6 = (ushort)bStack_1b70;
      uStack_fb4 = (ushort)local_2158;
      uStack_fb2 = (ushort)bStack_1b90;
      uStack_fae = (ushort)bStack_1bb0;
      uStack_fac = (ushort)local_2198;
      uStack_faa = (ushort)bStack_1bd0;
      uStack_fc6 = (ushort)bVar1;
      uStack_fc4 = (ushort)bVar1;
      uStack_fc2 = (ushort)bVar1;
      uStack_fbe = (ushort)bVar1;
      uStack_fbc = (ushort)bVar1;
      uStack_fba = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_fd6 = (ushort)bStack_1b6f;
      uStack_fd4 = (ushort)bStack_2157;
      uStack_fd2 = (ushort)bStack_1b8f;
      uStack_fce = (ushort)bStack_1baf;
      uStack_fcc = (ushort)bStack_2197;
      uStack_fca = (ushort)bStack_1bcf;
      uStack_fe6 = (ushort)bVar2;
      uStack_fe4 = (ushort)bVar2;
      uStack_fe2 = (ushort)bVar2;
      uStack_fde = (ushort)bVar2;
      uStack_fdc = (ushort)bVar2;
      uStack_fda = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_ff6 = (ushort)bStack_1b6e;
      uStack_ff4 = (ushort)bStack_2156;
      uStack_ff2 = (ushort)bStack_1b8e;
      uStack_fee = (ushort)bStack_1bae;
      uStack_fec = (ushort)bStack_2196;
      uStack_fea = (ushort)bStack_1bce;
      uStack_1006 = (ushort)bVar3;
      uStack_1004 = (ushort)bVar3;
      uStack_1002 = (ushort)bVar3;
      uStack_ffe = (ushort)bVar3;
      uStack_ffc = (ushort)bVar3;
      uStack_ffa = (ushort)bVar3;
      uVar39 = (ushort)((ushort)local_2138 * (ushort)bVar1 + (ushort)bStack_2137 * (ushort)bVar2 +
                       (ushort)bStack_2136 * (ushort)bVar3) >> 8;
      uVar42 = (ushort)(uStack_fb6 * uStack_fc6 + uStack_fd6 * uStack_fe6 + uStack_ff6 * uStack_1006
                       ) >> 8;
      uVar45 = (ushort)(uStack_fb4 * uStack_fc4 + uStack_fd4 * uStack_fe4 + uStack_ff4 * uStack_1004
                       ) >> 8;
      uVar50 = (ushort)(uStack_fb2 * uStack_fc2 + uStack_fd2 * uStack_fe2 + uStack_ff2 * uStack_1002
                       ) >> 8;
      uVar53 = (ushort)((ushort)local_2178 * (ushort)bVar1 + (ushort)bStack_2177 * (ushort)bVar2 +
                       (ushort)bStack_2176 * (ushort)bVar3) >> 8;
      uVar56 = (ushort)(uStack_fae * uStack_fbe + uStack_fce * uStack_fde + uStack_fee * uStack_ffe)
               >> 8;
      uVar59 = (ushort)(uStack_fac * uStack_fbc + uStack_fcc * uStack_fdc + uStack_fec * uStack_ffc)
               >> 8;
      uVar62 = (ushort)(uStack_faa * uStack_fba + uStack_fca * uStack_fda + uStack_fea * uStack_ffa)
               >> 8;
      uStack_a16 = (ushort)bStack_1b6e;
      uStack_a14 = (ushort)bStack_2156;
      uStack_a12 = (ushort)bStack_1b8e;
      uStack_a0e = (ushort)bStack_1bae;
      uStack_a0c = (ushort)bStack_2196;
      uStack_a0a = (ushort)bStack_1bce;
      uStack_a36 = (ushort)bStack_1b70;
      uStack_a34 = (ushort)local_2158;
      uStack_a32 = (ushort)bStack_1b90;
      uStack_a2e = (ushort)bStack_1bb0;
      uStack_a2c = (ushort)local_2198;
      uStack_a2a = (ushort)bStack_1bd0;
      bVar1 = pRVar27->r_factor;
      uStack_1016 = (ushort)bStack_1b6c;
      uStack_1014 = (ushort)bStack_2154;
      uStack_1012 = (ushort)bStack_1b8c;
      uStack_100e = (ushort)bStack_1bac;
      uStack_100c = (ushort)bStack_2194;
      uStack_100a = (ushort)bStack_1bcc;
      uStack_1026 = (ushort)bVar1;
      uStack_1024 = (ushort)bVar1;
      uStack_1022 = (ushort)bVar1;
      uStack_101e = (ushort)bVar1;
      uStack_101c = (ushort)bVar1;
      uStack_101a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_1036 = (ushort)bStack_1b6b;
      uStack_1034 = (ushort)bStack_2153;
      uStack_1032 = (ushort)bStack_1b8b;
      uStack_102e = (ushort)bStack_1bab;
      uStack_102c = (ushort)bStack_2193;
      uStack_102a = (ushort)bStack_1bcb;
      uStack_1046 = (ushort)bVar2;
      uStack_1044 = (ushort)bVar2;
      uStack_1042 = (ushort)bVar2;
      uStack_103e = (ushort)bVar2;
      uStack_103c = (ushort)bVar2;
      uStack_103a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_1056 = (ushort)bStack_1b6a;
      uStack_1054 = (ushort)bStack_2152;
      uStack_1052 = (ushort)bStack_1b8a;
      uStack_104e = (ushort)bStack_1baa;
      uStack_104c = (ushort)bStack_2192;
      uStack_104a = (ushort)bStack_1bca;
      uStack_1066 = (ushort)bVar3;
      uStack_1064 = (ushort)bVar3;
      uStack_1062 = (ushort)bVar3;
      uStack_105e = (ushort)bVar3;
      uStack_105c = (ushort)bVar3;
      uStack_105a = (ushort)bVar3;
      uVar40 = (ushort)((ushort)bStack_2134 * (ushort)bVar1 + (ushort)bStack_2133 * (ushort)bVar2 +
                       (ushort)bStack_2132 * (ushort)bVar3) >> 8;
      uVar43 = (ushort)(uStack_1016 * uStack_1026 + uStack_1036 * uStack_1046 +
                       uStack_1056 * uStack_1066) >> 8;
      uVar46 = (ushort)(uStack_1014 * uStack_1024 + uStack_1034 * uStack_1044 +
                       uStack_1054 * uStack_1064) >> 8;
      uVar51 = (ushort)(uStack_1012 * uStack_1022 + uStack_1032 * uStack_1042 +
                       uStack_1052 * uStack_1062) >> 8;
      uVar54 = (ushort)((ushort)bStack_2174 * (ushort)bVar1 + (ushort)bStack_2173 * (ushort)bVar2 +
                       (ushort)bStack_2172 * (ushort)bVar3) >> 8;
      uVar57 = (ushort)(uStack_100e * uStack_101e + uStack_102e * uStack_103e +
                       uStack_104e * uStack_105e) >> 8;
      uVar60 = (ushort)(uStack_100c * uStack_101c + uStack_102c * uStack_103c +
                       uStack_104c * uStack_105c) >> 8;
      uVar63 = (ushort)(uStack_100a * uStack_101a + uStack_102a * uStack_103a +
                       uStack_104a * uStack_105a) >> 8;
      uStack_a56 = (ushort)bStack_1b6a;
      uStack_a54 = (ushort)bStack_2152;
      uStack_a52 = (ushort)bStack_1b8a;
      uStack_a4e = (ushort)bStack_1baa;
      uStack_a4c = (ushort)bStack_2192;
      uStack_a4a = (ushort)bStack_1bca;
      uStack_a76 = (ushort)bStack_1b6c;
      uStack_a74 = (ushort)bStack_2154;
      uStack_a72 = (ushort)bStack_1b8c;
      uStack_a6e = (ushort)bStack_1bac;
      uStack_a6c = (ushort)bStack_2194;
      uStack_a6a = (ushort)bStack_1bcc;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_1086 = (ushort)bVar1;
      uStack_1084 = (ushort)bVar1;
      uStack_1082 = (ushort)bVar1;
      uStack_107e = (ushort)bVar1;
      uStack_107c = (ushort)bVar1;
      uStack_107a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_1546 = (ushort)bVar2;
      uStack_1544 = (ushort)bVar2;
      uStack_1542 = (ushort)bVar2;
      uStack_153e = (ushort)bVar2;
      uStack_153c = (ushort)bVar2;
      uStack_153a = (ushort)bVar2;
      uVar29 = ((ushort)(uVar39 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1546 = ((ushort)(uVar42 * uStack_1086) >> 7) + uStack_1546;
      uStack_1544 = ((ushort)(uVar45 * uStack_1084) >> 7) + uStack_1544;
      uStack_1542 = ((ushort)(uVar50 * uStack_1082) >> 7) + uStack_1542;
      uVar31 = ((ushort)(uVar53 * bVar1) >> 7) + (ushort)bVar2;
      uStack_153e = ((ushort)(uVar56 * uStack_107e) >> 7) + uStack_153e;
      uStack_153c = ((ushort)(uVar59 * uStack_107c) >> 7) + uStack_153c;
      uStack_153a = ((ushort)(uVar62 * uStack_107a) >> 7) + uStack_153a;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_10a6 = (ushort)bVar1;
      uStack_10a4 = (ushort)bVar1;
      uStack_10a2 = (ushort)bVar1;
      uStack_109e = (ushort)bVar1;
      uStack_109c = (ushort)bVar1;
      uStack_109a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_1566 = (ushort)bVar2;
      uStack_1564 = (ushort)bVar2;
      uStack_1562 = (ushort)bVar2;
      uStack_155e = (ushort)bVar2;
      uStack_155c = (ushort)bVar2;
      uStack_155a = (ushort)bVar2;
      uVar30 = ((ushort)(uVar40 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1566 = ((ushort)(uVar43 * uStack_10a6) >> 7) + uStack_1566;
      uStack_1564 = ((ushort)(uVar46 * uStack_10a4) >> 7) + uStack_1564;
      uStack_1562 = ((ushort)(uVar51 * uStack_10a2) >> 7) + uStack_1562;
      uVar32 = ((ushort)(uVar54 * bVar1) >> 7) + (ushort)bVar2;
      uStack_155e = ((ushort)(uVar57 * uStack_109e) >> 7) + uStack_155e;
      uStack_155c = ((ushort)(uVar60 * uStack_109c) >> 7) + uStack_155c;
      uStack_155a = ((ushort)(uVar63 * uStack_109a) >> 7) + uStack_155a;
      *(ulong *)(y_ptr2 + 0x10) =
           CONCAT17((uStack_1562 != 0) * (uStack_1562 < 0x100) * (char)uStack_1562 -
                    (0xff < uStack_1562),
                    CONCAT16((uStack_1542 != 0) * (uStack_1542 < 0x100) * (char)uStack_1542 -
                             (0xff < uStack_1542),
                             CONCAT15((uStack_1564 != 0) * (uStack_1564 < 0x100) * (char)uStack_1564
                                      - (0xff < uStack_1564),
                                      CONCAT14((uStack_1544 != 0) * (uStack_1544 < 0x100) *
                                               (char)uStack_1544 - (0xff < uStack_1544),
                                               CONCAT13((uStack_1566 != 0) * (uStack_1566 < 0x100) *
                                                        (char)uStack_1566 - (0xff < uStack_1566),
                                                        CONCAT12((uStack_1546 != 0) *
                                                                 (uStack_1546 < 0x100) *
                                                                 (char)uStack_1546 -
                                                                 (0xff < uStack_1546),
                                                                 CONCAT11((uVar30 != 0) *
                                                                          (uVar30 < 0x100) *
                                                                          (char)uVar30 -
                                                                          (0xff < uVar30),
                                                                          (uVar29 != 0) *
                                                                          (uVar29 < 0x100) *
                                                                          (char)uVar29 -
                                                                          (0xff < uVar29))))))));
      *(ulong *)(y_ptr2 + 0x18) =
           CONCAT17((uStack_155a != 0) * (uStack_155a < 0x100) * (char)uStack_155a -
                    (0xff < uStack_155a),
                    CONCAT16((uStack_153a != 0) * (uStack_153a < 0x100) * (char)uStack_153a -
                             (0xff < uStack_153a),
                             CONCAT15((uStack_155c != 0) * (uStack_155c < 0x100) * (char)uStack_155c
                                      - (0xff < uStack_155c),
                                      CONCAT14((uStack_153c != 0) * (uStack_153c < 0x100) *
                                               (char)uStack_153c - (0xff < uStack_153c),
                                               CONCAT13((uStack_155e != 0) * (uStack_155e < 0x100) *
                                                        (char)uStack_155e - (0xff < uStack_155e),
                                                        CONCAT12((uStack_153e != 0) *
                                                                 (uStack_153e < 0x100) *
                                                                 (char)uStack_153e -
                                                                 (0xff < uStack_153e),
                                                                 CONCAT11((uVar32 != 0) *
                                                                          (uVar32 < 0x100) *
                                                                          (char)uVar32 -
                                                                          (0xff < uVar32),
                                                                          (uVar31 != 0) *
                                                                          (uVar31 < 0x100) *
                                                                          (char)uVar31 -
                                                                          (0xff < uVar31))))))));
      bVar1 = pRVar27->r_factor;
      uStack_10b6 = (ushort)bStack_1b80;
      uStack_10b4 = (ushort)local_2168;
      uStack_10b2 = (ushort)bStack_1ba0;
      uStack_10ae = (ushort)bStack_1bc0;
      uStack_10ac = (ushort)local_21a8;
      uStack_10aa = (ushort)bStack_1be0;
      uStack_10c6 = (ushort)bVar1;
      uStack_10c4 = (ushort)bVar1;
      uStack_10c2 = (ushort)bVar1;
      uStack_10be = (ushort)bVar1;
      uStack_10bc = (ushort)bVar1;
      uStack_10ba = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_10d6 = (ushort)bStack_1b7f;
      uStack_10d4 = (ushort)bStack_2167;
      uStack_10d2 = (ushort)bStack_1b9f;
      uStack_10ce = (ushort)bStack_1bbf;
      uStack_10cc = (ushort)bStack_21a7;
      uStack_10ca = (ushort)bStack_1bdf;
      uStack_10e6 = (ushort)bVar2;
      uStack_10e4 = (ushort)bVar2;
      uStack_10e2 = (ushort)bVar2;
      uStack_10de = (ushort)bVar2;
      uStack_10dc = (ushort)bVar2;
      uStack_10da = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_10f6 = (ushort)bStack_1b7e;
      uStack_10f4 = (ushort)bStack_2166;
      uStack_10f2 = (ushort)bStack_1b9e;
      uStack_10ee = (ushort)bStack_1bbe;
      uStack_10ec = (ushort)bStack_21a6;
      uStack_10ea = (ushort)bStack_1bde;
      uStack_1106 = (ushort)bVar3;
      uStack_1104 = (ushort)bVar3;
      uStack_1102 = (ushort)bVar3;
      uStack_10fe = (ushort)bVar3;
      uStack_10fc = (ushort)bVar3;
      uStack_10fa = (ushort)bVar3;
      uVar41 = (ushort)((ushort)local_2148 * (ushort)bVar1 + (ushort)bStack_2147 * (ushort)bVar2 +
                       (ushort)bStack_2146 * (ushort)bVar3) >> 8;
      uVar44 = (ushort)(uStack_10b6 * uStack_10c6 + uStack_10d6 * uStack_10e6 +
                       uStack_10f6 * uStack_1106) >> 8;
      uVar49 = (ushort)(uStack_10b4 * uStack_10c4 + uStack_10d4 * uStack_10e4 +
                       uStack_10f4 * uStack_1104) >> 8;
      uVar52 = (ushort)(uStack_10b2 * uStack_10c2 + uStack_10d2 * uStack_10e2 +
                       uStack_10f2 * uStack_1102) >> 8;
      uVar55 = (ushort)((ushort)local_2188 * (ushort)bVar1 + (ushort)bStack_2187 * (ushort)bVar2 +
                       (ushort)bStack_2186 * (ushort)bVar3) >> 8;
      uVar58 = (ushort)(uStack_10ae * uStack_10be + uStack_10ce * uStack_10de +
                       uStack_10ee * uStack_10fe) >> 8;
      uVar61 = (ushort)(uStack_10ac * uStack_10bc + uStack_10cc * uStack_10dc +
                       uStack_10ec * uStack_10fc) >> 8;
      uVar64 = (ushort)(uStack_10aa * uStack_10ba + uStack_10ca * uStack_10da +
                       uStack_10ea * uStack_10fa) >> 8;
      uStack_a96 = (ushort)bStack_1b7e;
      uStack_a94 = (ushort)bStack_2166;
      uStack_a92 = (ushort)bStack_1b9e;
      uStack_a8e = (ushort)bStack_1bbe;
      uStack_a8c = (ushort)bStack_21a6;
      uStack_a8a = (ushort)bStack_1bde;
      uStack_ab6 = (ushort)bStack_1b80;
      uStack_ab4 = (ushort)local_2168;
      uStack_ab2 = (ushort)bStack_1ba0;
      uStack_aae = (ushort)bStack_1bc0;
      uStack_aac = (ushort)local_21a8;
      uStack_aaa = (ushort)bStack_1be0;
      bVar1 = pRVar27->r_factor;
      uStack_1116 = (ushort)bStack_1b7c;
      uStack_1114 = (ushort)bStack_2164;
      uStack_1112 = (ushort)bStack_1b9c;
      uStack_110e = (ushort)bStack_1bbc;
      uStack_110c = (ushort)bStack_21a4;
      uStack_110a = (ushort)bStack_1bdc;
      uStack_1126 = (ushort)bVar1;
      uStack_1124 = (ushort)bVar1;
      uStack_1122 = (ushort)bVar1;
      uStack_111e = (ushort)bVar1;
      uStack_111c = (ushort)bVar1;
      uStack_111a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].g_factor;
      uStack_1136 = (ushort)bStack_1b7b;
      uStack_1134 = (ushort)bStack_2163;
      uStack_1132 = (ushort)bStack_1b9b;
      uStack_112e = (ushort)bStack_1bbb;
      uStack_112c = (ushort)bStack_21a3;
      uStack_112a = (ushort)bStack_1bdb;
      uStack_1146 = (ushort)bVar2;
      uStack_1144 = (ushort)bVar2;
      uStack_1142 = (ushort)bVar2;
      uStack_113e = (ushort)bVar2;
      uStack_113c = (ushort)bVar2;
      uStack_113a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar28].b_factor;
      uStack_1156 = (ushort)bStack_1b7a;
      uStack_1154 = (ushort)bStack_2162;
      uStack_1152 = (ushort)bStack_1b9a;
      uStack_114e = (ushort)bStack_1bba;
      uStack_114c = (ushort)bStack_21a2;
      uStack_114a = (ushort)bStack_1bda;
      uStack_1166 = (ushort)bVar3;
      uStack_1164 = (ushort)bVar3;
      uStack_1162 = (ushort)bVar3;
      uStack_115e = (ushort)bVar3;
      uStack_115c = (ushort)bVar3;
      uStack_115a = (ushort)bVar3;
      uVar29 = (ushort)((ushort)bStack_2144 * (ushort)bVar1 + (ushort)bStack_2143 * (ushort)bVar2 +
                       (ushort)bStack_2142 * (ushort)bVar3) >> 8;
      uVar32 = (ushort)(uStack_1116 * uStack_1126 + uStack_1136 * uStack_1146 +
                       uStack_1156 * uStack_1166) >> 8;
      uVar47 = (ushort)(uStack_1114 * uStack_1124 + uStack_1134 * uStack_1144 +
                       uStack_1154 * uStack_1164) >> 8;
      uVar48 = (ushort)(uStack_1112 * uStack_1122 + uStack_1132 * uStack_1142 +
                       uStack_1152 * uStack_1162) >> 8;
      uVar33 = (ushort)((ushort)bStack_2184 * (ushort)bVar1 + (ushort)bStack_2183 * (ushort)bVar2 +
                       (ushort)bStack_2182 * (ushort)bVar3) >> 8;
      uVar36 = (ushort)(uStack_110e * uStack_111e + uStack_112e * uStack_113e +
                       uStack_114e * uStack_115e) >> 8;
      uVar37 = (ushort)(uStack_110c * uStack_111c + uStack_112c * uStack_113c +
                       uStack_114c * uStack_115c) >> 8;
      uVar38 = (ushort)(uStack_110a * uStack_111a + uStack_112a * uStack_113a +
                       uStack_114a * uStack_115a) >> 8;
      uStack_ad6 = (ushort)bStack_1b7a;
      uStack_ad4 = (ushort)bStack_2162;
      uStack_ad2 = (ushort)bStack_1b9a;
      uStack_ace = (ushort)bStack_1bba;
      uStack_acc = (ushort)bStack_21a2;
      uStack_aca = (ushort)bStack_1bda;
      uStack_af6 = (ushort)bStack_1b7c;
      uStack_af4 = (ushort)bStack_2164;
      uStack_af2 = (ushort)bStack_1b9c;
      uStack_aee = (ushort)bStack_1bbc;
      uStack_aec = (ushort)bStack_21a4;
      uStack_aea = (ushort)bStack_1bdc;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_1186 = (ushort)bVar1;
      uStack_1184 = (ushort)bVar1;
      uStack_1182 = (ushort)bVar1;
      uStack_117e = (ushort)bVar1;
      uStack_117c = (ushort)bVar1;
      uStack_117a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_1686 = (ushort)bVar2;
      uStack_1684 = (ushort)bVar2;
      uStack_1682 = (ushort)bVar2;
      uStack_167e = (ushort)bVar2;
      uStack_167c = (ushort)bVar2;
      uStack_167a = (ushort)bVar2;
      uVar30 = ((ushort)(uVar41 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1686 = ((ushort)(uVar44 * uStack_1186) >> 7) + uStack_1686;
      uStack_1684 = ((ushort)(uVar49 * uStack_1184) >> 7) + uStack_1684;
      uStack_1682 = ((ushort)(uVar52 * uStack_1182) >> 7) + uStack_1682;
      uVar34 = ((ushort)(uVar55 * bVar1) >> 7) + (ushort)bVar2;
      uStack_167e = ((ushort)(uVar58 * uStack_117e) >> 7) + uStack_167e;
      uStack_167c = ((ushort)(uVar61 * uStack_117c) >> 7) + uStack_167c;
      uStack_167a = ((ushort)(uVar64 * uStack_117a) >> 7) + uStack_167a;
      bVar1 = RGB2YUV[uVar28].y_factor;
      uStack_11a6 = (ushort)bVar1;
      uStack_11a4 = (ushort)bVar1;
      uStack_11a2 = (ushort)bVar1;
      uStack_119e = (ushort)bVar1;
      uStack_119c = (ushort)bVar1;
      uStack_119a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar28].y_offset;
      uStack_16a6 = (ushort)bVar2;
      uStack_16a4 = (ushort)bVar2;
      uStack_16a2 = (ushort)bVar2;
      uStack_169e = (ushort)bVar2;
      uStack_169c = (ushort)bVar2;
      uStack_169a = (ushort)bVar2;
      uVar31 = ((ushort)(uVar29 * bVar1) >> 7) + (ushort)bVar2;
      uStack_16a6 = ((ushort)(uVar32 * uStack_11a6) >> 7) + uStack_16a6;
      uStack_16a4 = ((ushort)(uVar47 * uStack_11a4) >> 7) + uStack_16a4;
      uStack_16a2 = ((ushort)(uVar48 * uStack_11a2) >> 7) + uStack_16a2;
      uVar35 = ((ushort)(uVar33 * bVar1) >> 7) + (ushort)bVar2;
      uStack_169e = ((ushort)(uVar36 * uStack_119e) >> 7) + uStack_169e;
      uStack_169c = ((ushort)(uVar37 * uStack_119c) >> 7) + uStack_169c;
      uStack_169a = ((ushort)(uVar38 * uStack_119a) >> 7) + uStack_169a;
      *(ulong *)(u_ptr + 0x10) =
           CONCAT17((uStack_16a2 != 0) * (uStack_16a2 < 0x100) * (char)uStack_16a2 -
                    (0xff < uStack_16a2),
                    CONCAT16((uStack_1682 != 0) * (uStack_1682 < 0x100) * (char)uStack_1682 -
                             (0xff < uStack_1682),
                             CONCAT15((uStack_16a4 != 0) * (uStack_16a4 < 0x100) * (char)uStack_16a4
                                      - (0xff < uStack_16a4),
                                      CONCAT14((uStack_1684 != 0) * (uStack_1684 < 0x100) *
                                               (char)uStack_1684 - (0xff < uStack_1684),
                                               CONCAT13((uStack_16a6 != 0) * (uStack_16a6 < 0x100) *
                                                        (char)uStack_16a6 - (0xff < uStack_16a6),
                                                        CONCAT12((uStack_1686 != 0) *
                                                                 (uStack_1686 < 0x100) *
                                                                 (char)uStack_1686 -
                                                                 (0xff < uStack_1686),
                                                                 CONCAT11((uVar31 != 0) *
                                                                          (uVar31 < 0x100) *
                                                                          (char)uVar31 -
                                                                          (0xff < uVar31),
                                                                          (uVar30 != 0) *
                                                                          (uVar30 < 0x100) *
                                                                          (char)uVar30 -
                                                                          (0xff < uVar30))))))));
      *(ulong *)(u_ptr + 0x18) =
           CONCAT17((uStack_169a != 0) * (uStack_169a < 0x100) * (char)uStack_169a -
                    (0xff < uStack_169a),
                    CONCAT16((uStack_167a != 0) * (uStack_167a < 0x100) * (char)uStack_167a -
                             (0xff < uStack_167a),
                             CONCAT15((uStack_169c != 0) * (uStack_169c < 0x100) * (char)uStack_169c
                                      - (0xff < uStack_169c),
                                      CONCAT14((uStack_167c != 0) * (uStack_167c < 0x100) *
                                               (char)uStack_167c - (0xff < uStack_167c),
                                               CONCAT13((uStack_169e != 0) * (uStack_169e < 0x100) *
                                                        (char)uStack_169e - (0xff < uStack_169e),
                                                        CONCAT12((uStack_167e != 0) *
                                                                 (uStack_167e < 0x100) *
                                                                 (char)uStack_167e -
                                                                 (0xff < uStack_167e),
                                                                 CONCAT11((uVar35 != 0) *
                                                                          (uVar35 < 0x100) *
                                                                          (char)uVar35 -
                                                                          (0xff < uVar35),
                                                                          (uVar34 != 0) *
                                                                          (uVar34 < 0x100) *
                                                                          (char)uVar34 -
                                                                          (0xff < uVar34))))))));
      auVar22._2_2_ =
           (uStack_a16 - uVar42) + (uStack_a56 - uVar43) + (uStack_a96 - uVar44) +
           (uStack_ad6 - uVar32);
      auVar22._0_2_ =
           (bStack_2136 - uVar39) + (bStack_2132 - uVar40) + (bStack_2146 - uVar41) +
           (bStack_2142 - uVar29);
      auVar22._4_2_ =
           (uStack_a14 - uVar45) + (uStack_a54 - uVar46) + (uStack_a94 - uVar49) +
           (uStack_ad4 - uVar47);
      auVar22._6_2_ =
           (uStack_a12 - uVar50) + (uStack_a52 - uVar51) + (uStack_a92 - uVar52) +
           (uStack_ad2 - uVar48);
      auVar22._10_2_ =
           (uStack_a0e - uVar56) + (uStack_a4e - uVar57) + (uStack_a8e - uVar58) +
           (uStack_ace - uVar36);
      auVar22._8_2_ =
           (bStack_2176 - uVar53) + (bStack_2172 - uVar54) + (bStack_2186 - uVar55) +
           (bStack_2182 - uVar33);
      auVar22._12_2_ =
           (uStack_a0c - uVar59) + (uStack_a4c - uVar60) + (uStack_a8c - uVar61) +
           (uStack_acc - uVar37);
      auVar22._14_2_ =
           (uStack_a0a - uVar62) + (uStack_a4a - uVar63) + (uStack_a8a - uVar64) +
           (uStack_aca - uVar38);
      auVar65 = psraw(auVar22,ZEXT416(2));
      bVar1 = RGB2YUV[uVar28].cb_factor;
      local_11b8 = auVar65._0_2_;
      sStack_11b6 = auVar65._2_2_;
      sStack_11b4 = auVar65._4_2_;
      sStack_11b2 = auVar65._6_2_;
      sStack_11b0 = auVar65._8_2_;
      sStack_11ae = auVar65._10_2_;
      sStack_11ac = auVar65._12_2_;
      sStack_11aa = auVar65._14_2_;
      uStack_11c6 = (ushort)bVar1;
      uStack_11c4 = (ushort)bVar1;
      uStack_11c2 = (ushort)bVar1;
      uStack_11be = (ushort)bVar1;
      uStack_11bc = (ushort)bVar1;
      uStack_11ba = (ushort)bVar1;
      auVar21._2_2_ = sStack_11b6 * uStack_11c6;
      auVar21._0_2_ = local_11b8 * (ushort)bVar1;
      auVar21._4_2_ = sStack_11b4 * uStack_11c4;
      auVar21._6_2_ = sStack_11b2 * uStack_11c2;
      auVar21._8_2_ = sStack_11b0 * (ushort)bVar1;
      auVar21._10_2_ = sStack_11ae * uStack_11be;
      auVar21._12_2_ = sStack_11ac * uStack_11bc;
      auVar21._14_2_ = sStack_11aa * uStack_11ba;
      auVar65 = psraw(auVar21,ZEXT416(8));
      local_16b8 = auVar65._0_2_;
      sStack_16b6 = auVar65._2_2_;
      sStack_16b4 = auVar65._4_2_;
      sStack_16b2 = auVar65._6_2_;
      sStack_16b0 = auVar65._8_2_;
      sStack_16ae = auVar65._10_2_;
      sStack_16ac = auVar65._12_2_;
      sStack_16aa = auVar65._14_2_;
      local_16b8 = local_16b8 + 0x80;
      sStack_16b6 = sStack_16b6 + 0x80;
      sStack_16b4 = sStack_16b4 + 0x80;
      sStack_16b2 = sStack_16b2 + 0x80;
      sStack_16b0 = sStack_16b0 + 0x80;
      sStack_16ae = sStack_16ae + 0x80;
      sStack_16ac = sStack_16ac + 0x80;
      sStack_16aa = sStack_16aa + 0x80;
      auVar20._2_2_ =
           (uStack_a36 - uVar42) + (uStack_a76 - uVar43) + (uStack_ab6 - uVar44) +
           (uStack_af6 - uVar32);
      auVar20._0_2_ =
           (local_2138 - uVar39) + (bStack_2134 - uVar40) + (local_2148 - uVar41) +
           (bStack_2144 - uVar29);
      auVar20._4_2_ =
           (uStack_a34 - uVar45) + (uStack_a74 - uVar46) + (uStack_ab4 - uVar49) +
           (uStack_af4 - uVar47);
      auVar20._6_2_ =
           (uStack_a32 - uVar50) + (uStack_a72 - uVar51) + (uStack_ab2 - uVar52) +
           (uStack_af2 - uVar48);
      auVar20._10_2_ =
           (uStack_a2e - uVar56) + (uStack_a6e - uVar57) + (uStack_aae - uVar58) +
           (uStack_aee - uVar36);
      auVar20._8_2_ =
           (local_2178 - uVar53) + (bStack_2174 - uVar54) + (local_2188 - uVar55) +
           (bStack_2184 - uVar33);
      auVar20._12_2_ =
           (uStack_a2c - uVar59) + (uStack_a6c - uVar60) + (uStack_aac - uVar61) +
           (uStack_aec - uVar37);
      auVar20._14_2_ =
           (uStack_a2a - uVar62) + (uStack_a6a - uVar63) + (uStack_aaa - uVar64) +
           (uStack_aea - uVar38);
      auVar65 = psraw(auVar20,ZEXT416(2));
      bVar1 = RGB2YUV[uVar28].cr_factor;
      local_11d8 = auVar65._0_2_;
      sStack_11d6 = auVar65._2_2_;
      sStack_11d4 = auVar65._4_2_;
      sStack_11d2 = auVar65._6_2_;
      sStack_11d0 = auVar65._8_2_;
      sStack_11ce = auVar65._10_2_;
      sStack_11cc = auVar65._12_2_;
      sStack_11ca = auVar65._14_2_;
      uStack_11e6 = (ushort)bVar1;
      uStack_11e4 = (ushort)bVar1;
      uStack_11e2 = (ushort)bVar1;
      uStack_11de = (ushort)bVar1;
      uStack_11dc = (ushort)bVar1;
      uStack_11da = (ushort)bVar1;
      auVar65._2_2_ = sStack_11d6 * uStack_11e6;
      auVar65._0_2_ = local_11d8 * (ushort)bVar1;
      auVar65._4_2_ = sStack_11d4 * uStack_11e4;
      auVar65._6_2_ = sStack_11d2 * uStack_11e2;
      auVar65._8_2_ = sStack_11d0 * (ushort)bVar1;
      auVar65._10_2_ = sStack_11ce * uStack_11de;
      auVar65._12_2_ = sStack_11cc * uStack_11dc;
      auVar65._14_2_ = sStack_11ca * uStack_11da;
      auVar65 = psraw(auVar65,ZEXT416(8));
      local_16d8 = auVar65._0_2_;
      sStack_16d6 = auVar65._2_2_;
      sStack_16d4 = auVar65._4_2_;
      sStack_16d2 = auVar65._6_2_;
      sStack_16d0 = auVar65._8_2_;
      sStack_16ce = auVar65._10_2_;
      sStack_16cc = auVar65._12_2_;
      sStack_16ca = auVar65._14_2_;
      local_16d8 = local_16d8 + 0x80;
      sStack_16d6 = sStack_16d6 + 0x80;
      sStack_16d4 = sStack_16d4 + 0x80;
      sStack_16d2 = sStack_16d2 + 0x80;
      sStack_16d0 = sStack_16d0 + 0x80;
      sStack_16ce = sStack_16ce + 0x80;
      sStack_16cc = sStack_16cc + 0x80;
      sStack_16ca = sStack_16ca + 0x80;
      *(ulong *)v_ptr =
           CONCAT17((0 < sStack_142a) * (sStack_142a < 0x100) * (char)sStack_142a -
                    (0xff < sStack_142a),
                    CONCAT16((0 < sStack_142c) * (sStack_142c < 0x100) * (char)sStack_142c -
                             (0xff < sStack_142c),
                             CONCAT15((0 < sStack_142e) * (sStack_142e < 0x100) * (char)sStack_142e
                                      - (0xff < sStack_142e),
                                      CONCAT14((0 < sStack_1430) * (sStack_1430 < 0x100) *
                                               (char)sStack_1430 - (0xff < sStack_1430),
                                               CONCAT13((0 < sStack_1432) * (sStack_1432 < 0x100) *
                                                        (char)sStack_1432 - (0xff < sStack_1432),
                                                        CONCAT12((0 < sStack_1434) *
                                                                 (sStack_1434 < 0x100) *
                                                                 (char)sStack_1434 -
                                                                 (0xff < sStack_1434),
                                                                 CONCAT11((0 < sStack_1436) *
                                                                          (sStack_1436 < 0x100) *
                                                                          (char)sStack_1436 -
                                                                          (0xff < sStack_1436),
                                                                          (0 < local_1438) *
                                                                          (local_1438 < 0x100) *
                                                                          (char)local_1438 -
                                                                          (0xff < local_1438))))))))
      ;
      *(ulong *)(v_ptr + 8) =
           CONCAT17((0 < sStack_16aa) * (sStack_16aa < 0x100) * (char)sStack_16aa -
                    (0xff < sStack_16aa),
                    CONCAT16((0 < sStack_16ac) * (sStack_16ac < 0x100) * (char)sStack_16ac -
                             (0xff < sStack_16ac),
                             CONCAT15((0 < sStack_16ae) * (sStack_16ae < 0x100) * (char)sStack_16ae
                                      - (0xff < sStack_16ae),
                                      CONCAT14((0 < sStack_16b0) * (sStack_16b0 < 0x100) *
                                               (char)sStack_16b0 - (0xff < sStack_16b0),
                                               CONCAT13((0 < sStack_16b2) * (sStack_16b2 < 0x100) *
                                                        (char)sStack_16b2 - (0xff < sStack_16b2),
                                                        CONCAT12((0 < sStack_16b4) *
                                                                 (sStack_16b4 < 0x100) *
                                                                 (char)sStack_16b4 -
                                                                 (0xff < sStack_16b4),
                                                                 CONCAT11((0 < sStack_16b6) *
                                                                          (sStack_16b6 < 0x100) *
                                                                          (char)sStack_16b6 -
                                                                          (0xff < sStack_16b6),
                                                                          (0 < local_16b8) *
                                                                          (local_16b8 < 0x100) *
                                                                          (char)local_16b8 -
                                                                          (0xff < local_16b8))))))))
      ;
      *(ulong *)local_2450 =
           CONCAT17((0 < sStack_144a) * (sStack_144a < 0x100) * (char)sStack_144a -
                    (0xff < sStack_144a),
                    CONCAT16((0 < sStack_144c) * (sStack_144c < 0x100) * (char)sStack_144c -
                             (0xff < sStack_144c),
                             CONCAT15((0 < sStack_144e) * (sStack_144e < 0x100) * (char)sStack_144e
                                      - (0xff < sStack_144e),
                                      CONCAT14((0 < sStack_1450) * (sStack_1450 < 0x100) *
                                               (char)sStack_1450 - (0xff < sStack_1450),
                                               CONCAT13((0 < sStack_1452) * (sStack_1452 < 0x100) *
                                                        (char)sStack_1452 - (0xff < sStack_1452),
                                                        CONCAT12((0 < sStack_1454) *
                                                                 (sStack_1454 < 0x100) *
                                                                 (char)sStack_1454 -
                                                                 (0xff < sStack_1454),
                                                                 CONCAT11((0 < sStack_1456) *
                                                                          (sStack_1456 < 0x100) *
                                                                          (char)sStack_1456 -
                                                                          (0xff < sStack_1456),
                                                                          (0 < local_1458) *
                                                                          (local_1458 < 0x100) *
                                                                          (char)local_1458 -
                                                                          (0xff < local_1458))))))))
      ;
      *(ulong *)(local_2450 + 8) =
           CONCAT17((0 < sStack_16ca) * (sStack_16ca < 0x100) * (char)sStack_16ca -
                    (0xff < sStack_16ca),
                    CONCAT16((0 < sStack_16cc) * (sStack_16cc < 0x100) * (char)sStack_16cc -
                             (0xff < sStack_16cc),
                             CONCAT15((0 < sStack_16ce) * (sStack_16ce < 0x100) * (char)sStack_16ce
                                      - (0xff < sStack_16ce),
                                      CONCAT14((0 < sStack_16d0) * (sStack_16d0 < 0x100) *
                                               (char)sStack_16d0 - (0xff < sStack_16d0),
                                               CONCAT13((0 < sStack_16d2) * (sStack_16d2 < 0x100) *
                                                        (char)sStack_16d2 - (0xff < sStack_16d2),
                                                        CONCAT12((0 < sStack_16d4) *
                                                                 (sStack_16d4 < 0x100) *
                                                                 (char)sStack_16d4 -
                                                                 (0xff < sStack_16d4),
                                                                 CONCAT11((0 < sStack_16d6) *
                                                                          (sStack_16d6 < 0x100) *
                                                                          (char)sStack_16d6 -
                                                                          (0xff < sStack_16d6),
                                                                          (0 < local_16d8) *
                                                                          (local_16d8 < 0x100) *
                                                                          (char)local_16d8 -
                                                                          (0xff < local_16d8))))))))
      ;
      rgb_ptr2 = rgb_ptr2 + 0x80;
      y_ptr1 = y_ptr1 + 0x80;
      y_ptr2 = y_ptr2 + 0x20;
      u_ptr = u_ptr + 0x20;
      v_ptr = v_ptr + 0x10;
      local_2450 = local_2450 + 0x10;
    }
  }
  return;
}

Assistant:

void rgb32_yuv420_sseu(uint32_t width, uint32_t height, 
	const uint8_t *RGBA, uint32_t RGBA_stride, 
	uint8_t *Y, uint8_t *U, uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	YCbCrType yuv_type)
{
	#define LOAD_SI128 _mm_loadu_si128
	#define SAVE_SI128 _mm_storeu_si128
	const RGB2YUVParam *const param = &(RGB2YUV[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *rgb_ptr1=RGBA+y*RGBA_stride,
			*rgb_ptr2=RGBA+(y+1)*RGBA_stride;
		
		uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		for(x=0; x<(width-31); x+=32)
		{
			RGBA2YUV_32
			
			rgb_ptr1+=128;
			rgb_ptr2+=128;
			y_ptr1+=32;
			y_ptr2+=32;
			u_ptr+=16; 
			v_ptr+=16;
		}
	}
	#undef LOAD_SI128
	#undef SAVE_SI128
}